

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O2

void Godunov::ExtrapVelToFacesOnBox
               (Box *bx,int ncomp,Box *xbx,Box *ybx,Box *zbx,Array4<double> *qx,Array4<double> *qy,
               Array4<double> *qz,Array4<const_double> *q,Array4<const_double> *u_ad,
               Array4<const_double> *v_ad,Array4<const_double> *w_ad,Array4<double> *Imx,
               Array4<double> *Imy,Array4<double> *Imz,Array4<double> *Ipx,Array4<double> *Ipy,
               Array4<double> *Ipz,Array4<const_double> *f,Box *domain,Real *dx_arr,Real l_dt,
               BCRec *pbc,bool l_use_forces_in_trans,Real *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int i;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  double *pdVar46;
  double *pdVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  double *pdVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  double *pdVar59;
  Real *pRVar60;
  double *pdVar61;
  Real *pRVar62;
  Real *pRVar63;
  double *pdVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  Real *pRVar68;
  double *pdVar69;
  long lVar70;
  int iVar71;
  ulong uVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  double *pdVar80;
  int iVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  int k_1;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  ulong uVar97;
  Real *pRVar98;
  Real *pRVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  double *pdVar107;
  long lVar108;
  double *pdVar109;
  int iVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  double *pdVar114;
  long lVar115;
  long lVar116;
  int j_1;
  int iVar117;
  long lVar118;
  double *pdVar119;
  long lVar120;
  ulong uVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double *local_548;
  double *local_540;
  double *local_538;
  long local_530;
  double *local_528;
  double *local_520;
  double *local_518;
  double *local_510;
  long local_508;
  long local_500;
  double *local_4f8;
  long local_4f0;
  long local_4e8;
  double *local_4e0;
  long local_4d8;
  long local_4d0;
  long local_4c8;
  double *local_4c0;
  double *local_4b8;
  long local_4b0;
  double *local_4a0;
  double *local_498;
  double *local_490;
  double *local_488;
  long local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  long local_440;
  long local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  Real *local_408;
  long local_3f0;
  long local_3e8;
  double *local_3d0;
  double *local_3b8;
  double *local_3a0;
  double *local_398;
  double *local_360;
  Real *local_2d8;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int aiStack_2ac [2];
  undefined8 uStack_2a4;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  Box *local_270;
  long local_268;
  long local_260;
  double *local_258;
  long local_250;
  long local_248;
  long local_240;
  double *local_238;
  long local_230;
  double *local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  double *local_200;
  Box *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long local_1c8;
  long local_1c0;
  double local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  double *local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_148;
  double dStack_140;
  long local_130;
  long local_128;
  long local_120;
  double local_118;
  double local_110;
  Box *local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  double *local_d8;
  long local_d0;
  long local_c8;
  Box *local_c0;
  long local_b8;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  Array4<double> *local_60;
  long local_58;
  long local_50;
  double local_48;
  double dStack_40;
  
  local_1b8 = *dx_arr;
  local_110 = dx_arr[1];
  uVar1 = (bx->btype).itype;
  iVar36 = (bx->bigend).vect[1];
  iVar48 = (bx->bigend).vect[2];
  lVar86 = (long)iVar36 + 1;
  lVar90 = (long)iVar48 + 1;
  iVar110 = (int)lVar86;
  if ((uVar1 & 2) != 0) {
    iVar110 = iVar36;
  }
  iVar65 = (int)lVar90;
  if ((uVar1 & 4) != 0) {
    iVar65 = iVar48;
  }
  iVar2 = (bx->smallend).vect[0];
  lVar19 = (long)iVar2;
  iVar57 = (bx->bigend).vect[0];
  iVar88 = (~uVar1 & 1) + 1 + iVar57;
  iVar89 = iVar88 - iVar2;
  iVar117 = (bx->smallend).vect[1];
  lVar58 = (long)iVar117;
  iVar3 = (bx->smallend).vect[2];
  local_220 = (long)iVar3;
  local_248 = (long)ncomp;
  iVar71 = iVar2 + -1;
  iVar81 = (iVar57 + 2) - iVar71;
  uVar72 = 0;
  if (0 < ncomp) {
    uVar72 = (ulong)(uint)ncomp;
  }
  local_118 = dx_arr[2];
  lVar20 = (long)(iVar3 + -1);
  iVar4 = (u_ad->begin).z;
  lVar95 = (long)(iVar117 + -1);
  iVar5 = (u_ad->begin).y;
  lVar23 = u_ad->kstride;
  lVar67 = u_ad->jstride;
  iVar6 = (u_ad->begin).x;
  local_d0 = (long)(Imx->begin).z;
  local_160 = Imx->kstride;
  local_c8 = (long)(Imx->begin).y;
  local_168 = Imx->jstride;
  lVar13 = Ipx->kstride;
  lVar116 = Ipx->jstride;
  local_e8 = (long)iVar88;
  iVar88 = (domain->smallend).vect[0];
  lVar73 = (long)iVar88;
  iVar7 = (domain->smallend).vect[1];
  lVar111 = (long)iVar7;
  iVar8 = (domain->smallend).vect[2];
  lVar112 = (long)iVar8;
  local_1d4 = (domain->bigend).vect[0];
  lVar118 = (long)local_1d4;
  local_1d0 = (domain->bigend).vect[1];
  local_208 = (long)local_1d0;
  local_1cc = (domain->bigend).vect[2];
  lVar96 = (long)local_1cc;
  lVar93 = (long)((iVar36 - (iVar117 + -1)) + 2);
  local_260 = (long)((iVar48 - iVar3) + 3);
  lVar37 = (long)iVar81;
  local_198 = (long)((iVar110 - iVar117) + 1);
  local_158 = (long)((iVar65 - iVar3) + 1);
  pdVar64 = Ipx->p;
  lVar87 = Ipx->nstride;
  local_d8 = Imx->p;
  local_170 = Imx->nstride;
  lVar113 = (long)(Imx->begin).x;
  local_178 = Imy->p;
  lVar33 = Imy->jstride;
  local_1a8 = Imy->kstride;
  local_f0 = Imy->nstride;
  lVar49 = (long)(Imy->begin).x;
  local_218 = (long)(Imy->begin).y;
  local_180 = (long)(Imy->begin).z;
  pdVar44 = Imz->p;
  lVar56 = Imz->jstride;
  lVar29 = Imz->kstride;
  local_100 = Imz->nstride;
  lVar50 = (long)(Imz->begin).x;
  local_278 = (long)(Imz->begin).y;
  lVar38 = (long)(Imz->begin).z;
  pdVar80 = w_ad->p;
  lVar85 = w_ad->jstride;
  lVar34 = w_ad->kstride;
  lVar51 = (long)(w_ad->begin).x;
  lVar52 = (long)(w_ad->begin).y;
  lVar39 = (long)(w_ad->begin).z;
  uVar9 = (q->begin).x;
  local_130 = (long)(int)uVar9;
  local_1d4 = local_1d4 + 1;
  dVar130 = l_dt * 0.5;
  lVar53 = (long)iVar89;
  local_190 = lVar53 * lVar93;
  lVar21 = local_190 * local_260;
  local_2d8 = p + lVar21 * local_248;
  local_58 = local_e8 * 8;
  local_1b0 = lVar19 * 8;
  lVar40 = local_58 + lVar19 * -8;
  pdVar107 = u_ad->p;
  local_e0 = lVar113 * 8;
  pdVar43 = local_d8 +
            ((lVar19 + (lVar20 - local_d0) * local_160 + (lVar95 - local_c8) * local_168) - lVar113)
  ;
  local_120 = (long)(f->begin).z;
  local_128 = f->kstride;
  lVar94 = (lVar20 - local_120) * local_128;
  lVar74 = (long)(f->begin).y;
  lVar30 = f->jstride;
  lVar103 = (lVar95 - lVar74) * lVar30;
  local_b8 = lVar103 * 8;
  lVar75 = (long)(f->begin).x;
  dStack_140 = (double)local_148;
  local_148 = lVar75 * 8;
  local_200 = f->p;
  pdVar46 = local_200 + ((lVar19 + lVar103 + lVar94 + -1) - lVar75);
  lVar27 = f->nstride;
  pdVar24 = pdVar64 + ((lVar19 + (lVar20 - (Ipx->begin).z) * lVar13 +
                                 (lVar95 - (Ipx->begin).y) * lVar116 + -1) - (long)(Ipx->begin).x);
  pdVar109 = q->p;
  lVar31 = q->jstride;
  lVar32 = q->kstride;
  lVar28 = q->nstride;
  uVar10 = (q->begin).y;
  lVar82 = (long)(int)uVar10;
  uVar11 = (q->begin).z;
  lVar83 = (long)(int)uVar11;
  local_228 = Ipy->p;
  lVar79 = Ipy->jstride;
  lVar78 = Ipy->kstride;
  lVar84 = Ipy->nstride;
  iVar36 = (Ipy->begin).x;
  iVar48 = (Ipy->begin).y;
  iVar117 = (Ipy->begin).z;
  pdVar14 = v_ad->p;
  lVar102 = v_ad->jstride;
  lVar70 = v_ad->kstride;
  lVar76 = (long)(v_ad->begin).x;
  lVar77 = (long)(v_ad->begin).y;
  local_230 = (long)(v_ad->begin).z;
  local_258 = Ipz->p;
  lVar41 = Ipz->jstride;
  lVar42 = Ipz->kstride;
  lVar91 = Ipz->nstride;
  iVar3 = (Ipz->begin).x;
  local_290 = (long)(Ipz->begin).y;
  iVar12 = (Ipz->begin).z;
  local_210 = local_190 * 8;
  local_1e0 = local_160 * 8;
  local_238 = (double *)(local_168 * 8);
  lVar113 = local_128 * 8;
  local_408 = p;
  for (uVar97 = 0; uVar97 != uVar72; uVar97 = uVar97 + 1) {
    pdVar25 = pdVar107 +
              ((lVar19 + (lVar20 - iVar4) * lVar23 + (lVar95 - iVar5) * lVar67) - (long)iVar6);
    pdVar45 = pdVar24;
    pdVar35 = pdVar46;
    pRVar60 = local_2d8;
    pRVar68 = local_408;
    pdVar47 = pdVar43;
    for (lVar106 = lVar20; lVar106 <= lVar90; lVar106 = lVar106 + 1) {
      lVar104 = (lVar106 - lVar83) * lVar32;
      pdVar59 = pdVar25;
      pdVar26 = pdVar45;
      pdVar55 = pdVar35;
      pdVar54 = pdVar47;
      pRVar62 = pRVar68;
      pRVar98 = pRVar60;
      for (lVar66 = lVar95; lVar66 <= lVar86; lVar66 = lVar66 + 1) {
        if (iVar2 <= (int)((~uVar1 & 1) + iVar57)) {
          lVar22 = (lVar66 - lVar82) * lVar31;
          lVar105 = 0;
          do {
            dVar134 = pdVar26[lVar105];
            dVar122 = pdVar54[lVar105];
            if (l_use_forces_in_trans) {
              dVar134 = dVar134 + pdVar55[lVar105] * dVar130;
              dVar122 = dVar122 + (pdVar55 + lVar105)[1] * dVar130;
            }
            if (lVar73 < lVar19 + lVar105) {
              if (lVar118 < lVar19 + lVar105) {
                switch(pbc[uVar97].bc[3]) {
                case 1:
                case 2:
                case 4:
switchD_00380c9a_caseD_1:
                  dVar122 = dVar134;
                  dVar134 = dVar122;
                  break;
                case 3:
                  dVar122 = pdVar109[lVar22 + (long)(int)(local_1d4 - uVar9) +
                                              lVar104 + uVar97 * lVar28];
                  if (uVar97 == 0) goto switchD_00380cb2_caseD_1;
                  break;
                case -1:
                  goto switchD_00380c9a_caseD_ffffffff;
                }
              }
            }
            else {
              switch(pbc[uVar97].bc[0]) {
              case 1:
              case 2:
              case 4:
switchD_00380cb2_caseD_1:
                dVar134 = dVar122;
                break;
              case 3:
                dVar134 = pdVar109[lVar22 + (long)(int)(~uVar9 + iVar88) + lVar104 + uVar97 * lVar28
                                  ];
                if (uVar97 == 0) goto switchD_00380c9a_caseD_1;
                break;
              case -1:
switchD_00380c9a_caseD_ffffffff:
                dVar122 = 0.0;
                dVar134 = 0.0;
              }
            }
            dVar126 = pdVar59[lVar105];
            pRVar62[lVar105] = dVar134;
            pRVar98[lVar105] = dVar122;
            uVar121 = -(ulong)(0.0 <= dVar126);
            dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
            pdVar54[lVar105] =
                 dVar126 * (double)(~uVar121 & (ulong)dVar122 | uVar121 & (ulong)dVar134) +
                 (dVar122 + dVar134) * (1.0 - dVar126) * 0.5;
            lVar105 = lVar105 + 1;
          } while (iVar89 != (int)lVar105);
        }
        pRVar98 = pRVar98 + (local_e8 - lVar19);
        pRVar62 = pRVar62 + (local_e8 - lVar19);
        pdVar59 = pdVar59 + lVar67;
        pdVar54 = pdVar54 + local_168;
        pdVar55 = pdVar55 + lVar30;
        pdVar26 = pdVar26 + lVar116;
      }
      pRVar60 = pRVar60 + local_190;
      pRVar68 = pRVar68 + local_190;
      pdVar25 = pdVar25 + lVar23;
      pdVar47 = pdVar47 + local_160;
      pdVar35 = pdVar35 + local_128;
      pdVar45 = pdVar45 + lVar13;
    }
    local_2d8 = local_2d8 + lVar21;
    local_408 = local_408 + lVar21;
    pdVar43 = pdVar43 + local_170;
    pdVar46 = pdVar46 + lVar27;
    pdVar24 = pdVar24 + lVar87;
  }
  lVar106 = (long)iVar71;
  local_1d0 = local_1d0 + 1;
  pdVar43 = local_200 + ((lVar106 + (lVar58 - lVar74) * lVar30 + lVar94) - lVar75);
  pdVar107 = local_200 + ((lVar106 + ((lVar58 + -1) - lVar74) * lVar30 + lVar94) - lVar75);
  lVar23 = (lVar20 - lVar83) * lVar32;
  lVar67 = (int)(local_1d0 - uVar10) * lVar31;
  local_78 = lVar67 * 8;
  local_288 = local_130 * 8;
  pdVar46 = pdVar109 + ((lVar106 + lVar67 + lVar23) - local_130);
  lVar67 = (int)(~uVar10 + iVar7) * lVar31;
  local_70 = lVar67 * 8;
  pdVar24 = pdVar109 + ((lVar106 + lVar23 + lVar67) - local_130);
  local_f8 = lVar37 * local_198;
  local_68 = local_248 * local_260;
  local_1e8 = local_190 * 0x10 + local_f8 * 8;
  local_80 = local_1e8 * local_68;
  lVar87 = (long)(iVar57 + 2);
  lVar21 = lVar87 * 8 + lVar106 * -8;
  local_88 = local_190 * local_68 * 0x10;
  local_1a0 = lVar49 * 8;
  pdVar45 = local_178 +
            ((lVar106 + (lVar58 - local_218) * lVar33 + (lVar20 - local_180) * local_1a8) - lVar49);
  lVar49 = lVar33 * 8;
  pdVar25 = local_228 +
            ((lVar106 + ((lVar58 - iVar48) + -1) * lVar79 + (lVar20 - iVar117) * lVar78) -
            (long)iVar36);
  lVar23 = lVar32 * 8;
  lVar67 = local_f8 * 8;
  pRVar60 = (Real *)((long)p + local_80);
  pRVar68 = p + local_190 * local_68 * 2;
  lVar13 = lVar102 * 8;
  lVar116 = local_1a8 * 8;
  for (uVar97 = 0; pdVar35 = pdVar107, pRVar62 = pRVar68, pdVar47 = pdVar43, lVar94 = lVar20,
      pdVar59 = pdVar14 + ((lVar106 + (lVar58 - lVar77) * lVar102 + (lVar20 - local_230) * lVar70) -
                          lVar76), pdVar26 = pdVar25, pRVar98 = pRVar60, pdVar55 = pdVar45,
      local_540 = pdVar24, local_4b8 = pdVar46, uVar97 != uVar72; uVar97 = uVar97 + 1) {
    for (; pdVar54 = pdVar47, pdVar61 = pdVar26, pdVar69 = pdVar35, lVar66 = lVar58,
        pRVar63 = pRVar62, pRVar99 = pRVar98, pdVar114 = pdVar55, pdVar119 = pdVar59,
        lVar94 <= lVar90; lVar94 = lVar94 + 1) {
      for (; lVar66 <= iVar110; lVar66 = lVar66 + 1) {
        if (iVar71 <= iVar57 + 1) {
          lVar104 = 0;
          do {
            dVar122 = pdVar61[lVar104];
            dVar134 = pdVar114[lVar104];
            if (l_use_forces_in_trans) {
              dVar122 = dVar122 + pdVar69[lVar104] * dVar130;
              dVar134 = dVar134 + pdVar54[lVar104] * dVar130;
            }
            if (lVar111 < lVar66) {
              if (local_208 < lVar66) {
                switch(pbc[uVar97].bc[4]) {
                case 1:
                case 2:
                case 4:
switchD_00381387_caseD_1:
                  dVar134 = dVar122;
                  break;
                case 3:
                  dVar134 = local_4b8[lVar104];
                  if (uVar97 == 1) goto switchD_003813b5_caseD_1;
                  break;
                case -1:
                  goto switchD_00381387_caseD_ffffffff;
                }
              }
            }
            else {
              switch(pbc[uVar97].bc[1]) {
              case 1:
              case 2:
              case 4:
switchD_003813b5_caseD_1:
                dVar122 = dVar134;
                dVar134 = dVar122;
                break;
              case 3:
                dVar122 = local_540[lVar104];
                if (uVar97 == 1) goto switchD_00381387_caseD_1;
                break;
              case -1:
switchD_00381387_caseD_ffffffff:
                dVar134 = 0.0;
                dVar122 = 0.0;
              }
            }
            dVar126 = pdVar119[lVar104];
            pRVar63[lVar104] = dVar122;
            pRVar99[lVar104] = dVar134;
            uVar121 = -(ulong)(0.0 <= dVar126);
            dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
            pdVar114[lVar104] =
                 dVar126 * (double)(~uVar121 & (ulong)dVar134 | uVar121 & (ulong)dVar122) +
                 (dVar134 + dVar122) * (1.0 - dVar126) * 0.5;
            lVar104 = lVar104 + 1;
          } while (iVar81 != (int)lVar104);
        }
        pdVar54 = pdVar54 + lVar30;
        pdVar69 = pdVar69 + lVar30;
        pRVar99 = pRVar99 + (lVar87 - lVar106);
        pRVar63 = pRVar63 + (lVar87 - lVar106);
        pdVar119 = pdVar119 + lVar102;
        pdVar114 = pdVar114 + lVar33;
        pdVar61 = pdVar61 + lVar79;
      }
      pdVar35 = pdVar35 + local_128;
      pRVar62 = pRVar62 + local_f8;
      pdVar47 = pdVar47 + local_128;
      pdVar59 = pdVar59 + lVar70;
      pdVar26 = pdVar26 + lVar78;
      pRVar98 = pRVar98 + local_f8;
      pdVar55 = pdVar55 + local_1a8;
      local_540 = local_540 + lVar32;
      local_4b8 = local_4b8 + lVar32;
    }
    pdVar43 = pdVar43 + lVar27;
    pdVar107 = pdVar107 + lVar27;
    pdVar46 = pdVar46 + lVar28;
    pdVar24 = pdVar24 + lVar28;
    pRVar60 = pRVar60 + local_f8 * local_260;
    pRVar68 = pRVar68 + local_f8 * local_260;
    pdVar45 = pdVar45 + local_f0;
    pdVar25 = pdVar25 + lVar84;
  }
  local_1cc = local_1cc + 1;
  pdVar46 = local_200 + ((lVar106 + (local_220 - local_120) * local_128 + lVar103) - lVar75);
  pdVar43 = local_200 + ((lVar106 + ((local_220 + -1) - local_120) * local_128 + lVar103) - lVar75);
  lVar90 = (lVar95 - lVar82) * lVar31;
  local_188 = (int)(local_1cc - uVar11) * lVar32;
  local_528 = pdVar109 + ((lVar106 + lVar90 + local_188) - local_130);
  local_1c8 = (int)(~uVar11 + iVar8) * lVar32;
  local_488 = pdVar109 + ((lVar106 + lVar90 + local_1c8) - local_130);
  lVar84 = lVar93 * lVar37;
  lVar78 = lVar84 * local_158;
  local_50 = local_f8 * 0x10;
  local_268 = (local_190 * 0x10 + local_50) * local_260;
  local_1f0 = (local_268 + lVar78 * 8) * local_248;
  lVar75 = lVar84 * 8;
  local_268 = local_268 * local_248;
  local_240 = lVar50 * 8;
  pdVar24 = pdVar44 + ((lVar106 + (local_220 - lVar38) * lVar29 + (lVar95 - local_278) * lVar56) -
                      lVar50);
  pdVar107 = local_258 +
             ((lVar106 + ((local_220 - iVar12) + -1) * lVar42 + (lVar95 - local_290) * lVar41) -
             (long)iVar3);
  lVar90 = lVar31 * 8;
  pRVar60 = (Real *)((long)p + local_1f0);
  pRVar68 = (Real *)((long)p + local_268);
  lVar33 = lVar29 * 8;
  lVar79 = lVar56 * 8;
  for (uVar97 = 0; pdVar25 = pdVar24, pRVar62 = pRVar60, pdVar45 = pdVar43,
      pdVar35 = pdVar80 + ((lVar106 + (local_220 - lVar39) * lVar34 + (lVar95 - lVar52) * lVar85) -
                          lVar51), lVar50 = local_220, pRVar98 = pRVar68, pdVar47 = pdVar46,
      pdVar59 = pdVar107, uVar97 != uVar72; uVar97 = uVar97 + 1) {
    for (; local_398 = local_528, pdVar26 = pdVar25, pdVar55 = pdVar35, pRVar63 = pRVar62,
        pdVar54 = pdVar45, lVar94 = lVar95, pRVar99 = pRVar98, pdVar61 = pdVar47, pdVar69 = pdVar59,
        pdVar114 = local_488, lVar50 <= iVar65; lVar50 = lVar50 + 1) {
      for (; lVar94 <= lVar86; lVar94 = lVar94 + 1) {
        if (iVar71 <= iVar57 + 1) {
          lVar103 = 0;
          do {
            dVar122 = pdVar69[lVar103];
            dVar134 = pdVar26[lVar103];
            if (l_use_forces_in_trans) {
              dVar122 = dVar122 + pdVar54[lVar103] * dVar130;
              dVar134 = dVar134 + pdVar61[lVar103] * dVar130;
            }
            if (lVar112 < lVar50) {
              if (lVar96 < lVar50) {
                switch(pbc[uVar97].bc[5]) {
                case 1:
                case 2:
                case 4:
switchD_00381a33_caseD_1:
                  dVar134 = dVar122;
                  break;
                case 3:
                  dVar134 = local_398[lVar103];
                  if (uVar97 == 2) goto switchD_00381a61_caseD_1;
                  break;
                case -1:
                  goto switchD_00381a33_caseD_ffffffff;
                }
              }
            }
            else {
              switch(pbc[uVar97].bc[2]) {
              case 1:
              case 2:
              case 4:
switchD_00381a61_caseD_1:
                dVar122 = dVar134;
                dVar134 = dVar122;
                break;
              case 3:
                dVar122 = pdVar114[lVar103];
                if (uVar97 == 2) goto switchD_00381a33_caseD_1;
                break;
              case -1:
switchD_00381a33_caseD_ffffffff:
                dVar134 = 0.0;
                dVar122 = 0.0;
              }
            }
            dVar126 = pdVar55[lVar103];
            pRVar99[lVar103] = dVar122;
            pRVar63[lVar103] = dVar134;
            uVar121 = -(ulong)(0.0 <= dVar126);
            dVar126 = (double)(~-(ulong)(ABS(dVar126) < 1e-08) & 0x3ff0000000000000);
            pdVar26[lVar103] =
                 dVar126 * (double)(~uVar121 & (ulong)dVar134 | uVar121 & (ulong)dVar122) +
                 (dVar134 + dVar122) * (1.0 - dVar126) * 0.5;
            lVar103 = lVar103 + 1;
          } while (iVar81 != (int)lVar103);
        }
        pdVar61 = pdVar61 + lVar30;
        pdVar54 = pdVar54 + lVar30;
        local_398 = local_398 + lVar31;
        pdVar114 = pdVar114 + lVar31;
        pRVar63 = pRVar63 + (lVar87 - lVar106);
        pRVar99 = pRVar99 + (lVar87 - lVar106);
        pdVar55 = pdVar55 + lVar85;
        pdVar26 = pdVar26 + lVar56;
        pdVar69 = pdVar69 + lVar41;
      }
      pdVar25 = pdVar25 + lVar29;
      pRVar62 = pRVar62 + lVar84;
      pdVar45 = pdVar45 + local_128;
      pdVar35 = pdVar35 + lVar34;
      pRVar98 = pRVar98 + lVar84;
      pdVar47 = pdVar47 + local_128;
      pdVar59 = pdVar59 + lVar42;
    }
    pdVar46 = pdVar46 + lVar27;
    pdVar43 = pdVar43 + lVar27;
    local_528 = local_528 + lVar28;
    local_488 = local_488 + lVar28;
    pRVar60 = pRVar60 + lVar78;
    pRVar68 = pRVar68 + lVar78;
    pdVar24 = pdVar24 + local_100;
    pdVar107 = pdVar107 + lVar91;
  }
  iVar36 = (bx->smallend).vect[0];
  iVar48 = (bx->smallend).vect[1];
  iVar110 = (bx->bigend).vect[0];
  iVar65 = (bx->bigend).vect[1];
  iVar2 = (bx->bigend).vect[2];
  iVar57 = iVar36 + -1;
  lVar87 = (long)((iVar110 - iVar36) + 3);
  iVar110 = iVar110 + 1;
  iVar36 = 0;
  dVar134 = dVar130;
  local_280 = lVar102;
  local_270 = bx;
  local_250 = lVar85;
  local_1f8 = ybx;
  local_1c0 = lVar106;
  local_108 = xbx;
  local_c0 = zbx;
  local_60 = qx;
  local_48 = dVar130;
  dStack_40 = dVar130;
  for (lVar86 = (long)((bx->smallend).vect[2] + -1); lVar86 <= (long)iVar2 + 1; lVar86 = lVar86 + 1)
  {
    pdVar107 = (double *)((long)iVar36 * ((iVar65 - iVar48) + 3) * lVar87 * 8 + (long)pdVar64);
    for (iVar117 = iVar48 + -1; iVar117 <= iVar65 + 1; iVar117 = iVar117 + 1) {
      if (iVar57 <= iVar110) {
        memset(pdVar107,0,(ulong)(uint)(iVar110 - iVar57) * 8 + 8);
        dVar130 = local_48;
        dVar134 = dStack_40;
      }
      pdVar107 = pdVar107 + lVar87;
    }
    iVar36 = iVar36 + 1;
  }
  uVar17 = *(undefined8 *)(local_108->smallend).vect;
  uVar18 = *(undefined8 *)((local_108->smallend).vect + 2);
  aiStack_2ac[1] = (int)((ulong)*(undefined8 *)(local_108->bigend).vect >> 0x20);
  uStack_2a4 = *(undefined8 *)((local_108->bigend).vect + 2);
  iStack_2b0 = (int)uVar18;
  aiStack_2ac[0] = (int)((ulong)uVar18 >> 0x20);
  for (lVar86 = 0; lVar86 != 3; lVar86 = lVar86 + 1) {
    if ((uStack_2a4._4_4_ >> ((uint)lVar86 & 0x1f) & 1) != 0) {
      aiStack_2ac[lVar86] = aiStack_2ac[lVar86] + -1;
    }
  }
  local_2b8 = (int)uVar17;
  local_2b8 = local_2b8 + -1;
  iStack_2b4 = (int)((ulong)uVar17 >> 0x20);
  lVar84 = (long)iStack_2b4;
  lVar50 = (long)iStack_2b0;
  iVar36 = (aiStack_2ac[0] + 2) - local_2b8;
  lVar27 = (long)((aiStack_2ac[1] - iStack_2b4) + 2);
  lVar91 = (long)iVar36;
  lVar41 = (long)((aiStack_2ac[1] + 1) - iStack_2b4);
  dVar122 = -l_dt;
  dVar126 = dVar122 / (local_110 * 3.0);
  dVar127 = l_dt / (local_110 * 3.0);
  lVar28 = (lVar50 - lVar39) * lVar34;
  lVar94 = (long)local_2b8;
  lVar87 = lVar94 * 8;
  local_498 = pdVar80 + ((lVar28 + lVar94) - lVar51);
  lVar78 = (lVar50 - lVar83) * lVar32;
  local_528 = (double *)(((lVar87 + lVar78 * 8) - local_288) + (long)pdVar109);
  lVar86 = lVar50 + -1;
  local_488 = (double *)(((lVar87 + (lVar86 - lVar83) * lVar32 * 8) - local_288) + (long)pdVar109);
  lVar42 = (lVar50 - local_230) * lVar70;
  local_4f8 = pdVar14 + ((lVar42 + lVar94) - lVar76);
  local_460 = pdVar14 + (((lVar86 - local_230) * lVar70 + lVar94) - lVar76);
  local_490 = (double *)
              (((lVar87 + (lVar50 - local_180) * local_1a8 * 8) - local_1a0) + (long)local_178);
  local_500 = ((lVar87 + (lVar86 - local_180) * local_1a8 * 8) - local_1a0) + (long)local_178;
  local_480 = local_1f0 + lVar94 * 8 + lVar106 * -8 + (long)p;
  local_508 = local_268 + lVar94 * 8 + lVar106 * -8 + (long)p;
  local_4a0 = local_258;
  for (lVar86 = lVar50; lVar103 = lVar84, lVar86 <= (long)(int)uStack_2a4 + 1; lVar86 = lVar86 + 1)
  {
    while (lVar103 <= aiStack_2ac[1]) {
      if (aiStack_2ac[0] + 1 < local_2b8) {
        lVar103 = lVar103 + 1;
      }
      else {
        lVar66 = lVar103 + 1;
        lVar104 = lVar103 - lVar52;
        lVar105 = lVar103 - lVar84;
        lVar22 = (lVar103 - lVar82) * lVar90;
        lVar108 = (lVar103 - lVar77) * lVar13;
        lVar120 = (lVar66 - lVar77) * lVar13;
        lVar101 = (lVar103 - local_218) * lVar49;
        lVar115 = (lVar66 - local_218) * lVar49;
        lVar92 = ((lVar50 - local_220) * lVar93 * 8 + lVar95 * -8 + lVar103 * 8) * lVar37;
        lVar100 = 0;
        do {
          dVar123 = *(double *)((long)local_460 + lVar100 * 8 + lVar108);
          dVar124 = *(double *)((long)local_4f8 + lVar100 * 8 + lVar108);
          dVar128 = *(double *)((long)local_460 + lVar100 * 8 + lVar120);
          dVar125 = *(double *)((long)local_4f8 + lVar100 * 8 + lVar120);
          dVar123 = *(double *)(lVar92 + local_508 + lVar100 * 8) +
                    (*(double *)(lVar115 + local_500 + lVar100 * 8) * dVar128 -
                    *(double *)(lVar101 + local_500 + lVar100 * 8) * dVar123) * dVar126 +
                    (dVar128 - dVar123) *
                    *(double *)(lVar22 + (long)local_488 + lVar100 * 8) * dVar127 + 0.0;
          dVar124 = *(double *)(local_480 + lVar92 + lVar100 * 8) +
                    (*(double *)((long)local_490 + lVar115 + lVar100 * 8) * dVar125 -
                    *(double *)((long)local_490 + lVar101 + lVar100 * 8) * dVar124) * dVar126 +
                    (dVar125 - dVar124) *
                    *(double *)((long)local_528 + lVar22 + lVar100 * 8) * dVar127 + 0.0;
          if (lVar112 < lVar86) {
            if (lVar96 < lVar86) {
              switch(pbc->bc[5]) {
              case 0:
                break;
              case 1:
              case 2:
              case 4:
                dVar124 = dVar123;
                break;
              case 3:
                dVar124 = *(double *)
                           ((long)pdVar109 +
                           lVar100 * 8 + lVar22 + ((lVar87 + local_188 * 8) - local_288));
                break;
              case -1:
                dVar123 = 0.0;
                dVar124 = 0.0;
                break;
              default:
                goto switchD_003822db_default;
              }
            }
          }
          else {
            switch(pbc->bc[2]) {
            case 1:
            case 2:
            case 4:
              dVar123 = dVar124;
              break;
            case 3:
              dVar123 = *(double *)
                         ((long)pdVar109 +
                         lVar100 * 8 + lVar22 + ((lVar87 + local_1c8 * 8) - local_288));
              break;
            case -1:
              dVar123 = 0.0;
              dVar124 = 0.0;
            }
          }
switchD_003822db_default:
          dVar128 = *(double *)((long)local_498 + lVar100 * 8 + lVar104 * lVar85 * 8);
          uVar72 = -(ulong)(0.0 <= dVar128);
          dVar128 = (double)(~-(ulong)(ABS(dVar128) < 1e-08) & 0x3ff0000000000000);
          *(double *)((long)local_4a0 + lVar100 * 8 + lVar105 * lVar91 * 8) =
               dVar128 * (double)(~uVar72 & (ulong)dVar124 | uVar72 & (ulong)dVar123) +
               (dVar124 + dVar123) * (1.0 - dVar128) * 0.5;
          lVar100 = lVar100 + 1;
          lVar103 = lVar66;
        } while (iVar36 != (int)lVar100);
      }
    }
    local_4a0 = local_4a0 + lVar91 * lVar41;
    local_498 = local_498 + lVar34;
    local_528 = (double *)((long)local_528 + lVar23);
    local_488 = (double *)((long)local_488 + lVar23);
    local_4f8 = local_4f8 + lVar70;
    local_460 = local_460 + lVar70;
    local_490 = (double *)((long)local_490 + lVar116);
    local_500 = local_500 + lVar116;
    local_480 = local_480 + lVar75;
    local_508 = local_508 + lVar75;
  }
  lVar86 = lVar84 + -1;
  lVar104 = (lVar84 - lVar52) * local_250;
  lVar22 = ((lVar50 + 1) - lVar39) * lVar34;
  lVar100 = (lVar86 - lVar52) * local_250;
  lVar66 = (lVar50 - lVar38) * lVar29;
  lVar108 = (lVar84 - local_278) * lVar56 * 8;
  lVar105 = ((lVar50 + 1) - lVar38) * lVar29;
  lVar103 = (lVar86 - local_278) * lVar56;
  lVar92 = (lVar84 * 8 + (lVar50 - lVar20) * local_198 * 8 + lVar58 * -8) * lVar37;
  dVar123 = dVar122 / (local_118 * 3.0);
  dVar124 = l_dt / (local_118 * 3.0);
  lVar87 = lVar91 * lVar27;
  pdVar24 = pdVar14 + ((lVar94 + lVar42 + local_280 * (lVar84 - lVar77)) - lVar76);
  local_498 = (double *)(((local_78 + lVar78 * 8 + lVar94 * 8) - local_288) + (long)pdVar109);
  local_510 = (double *)(((local_70 + lVar78 * 8 + lVar94 * 8) - local_288) + (long)pdVar109);
  lVar101 = (((lVar84 - lVar82) * lVar31 * 8 + lVar78 * 8 + lVar94 * 8) - local_288) +
            (long)pdVar109;
  lVar42 = ((lVar78 * 8 + (lVar86 - lVar82) * lVar31 * 8 + lVar94 * 8) - local_288) + (long)pdVar109
  ;
  local_490 = pdVar80 + ((lVar94 + lVar28 + lVar104) - lVar51);
  pdVar64 = pdVar80 + ((lVar94 + lVar22 + lVar104) - lVar51);
  pdVar107 = pdVar80 + ((lVar94 + lVar100 + lVar28) - lVar51);
  pdVar46 = pdVar80 + ((lVar94 + lVar100 + lVar22) - lVar51);
  lVar28 = ((lVar108 + lVar66 * 8 + lVar94 * 8) - local_240) + (long)pdVar44;
  lVar78 = ((lVar108 + lVar105 * 8 + lVar94 * 8) - local_240) + (long)pdVar44;
  local_500 = ((lVar66 * 8 + lVar103 * 8 + lVar94 * 8) - local_240) + (long)pdVar44;
  local_480 = ((lVar105 * 8 + lVar103 * 8 + lVar94 * 8) - local_240) + (long)pdVar44;
  local_508 = local_80 + lVar92 + lVar94 * 8 + lVar106 * -8 + (long)p;
  lVar103 = local_88 + lVar92 + lVar94 * 8 + lVar106 * -8 + (long)p;
  local_4a0 = local_228;
  lVar86 = lVar50;
  while (lVar86 <= (int)uStack_2a4) {
    lVar86 = lVar86 + 1;
    local_548 = local_4a0;
    lVar66 = lVar78;
    lVar104 = lVar42;
    pdVar43 = local_490;
    lVar22 = local_508;
    lVar105 = local_500;
    pdVar25 = pdVar64;
    pdVar45 = pdVar46;
    pdVar35 = pdVar107;
    lVar92 = local_480;
    lVar100 = lVar28;
    lVar115 = lVar103;
    local_538 = pdVar24;
    local_4f0 = lVar101;
    for (lVar108 = lVar84; lVar108 <= aiStack_2ac[1] + 1; lVar108 = lVar108 + 1) {
      if (local_2b8 <= aiStack_2ac[0] + 1) {
        lVar120 = 0;
        do {
          dVar128 = *(double *)(lVar115 + lVar120 * 8) +
                    (*(double *)(lVar92 + lVar120 * 8) * pdVar45[lVar120] -
                    *(double *)(lVar105 + lVar120 * 8) * pdVar35[lVar120]) * dVar123 +
                    (pdVar45[lVar120] - pdVar35[lVar120]) *
                    *(double *)(lVar104 + lVar120 * 8) * dVar124 + 0.0;
          dVar125 = *(double *)(lVar22 + lVar120 * 8) +
                    (*(double *)(lVar66 + lVar120 * 8) * pdVar25[lVar120] -
                    *(double *)(lVar100 + lVar120 * 8) * pdVar43[lVar120]) * dVar123 +
                    (pdVar25[lVar120] - pdVar43[lVar120]) *
                    *(double *)(local_4f0 + lVar120 * 8) * dVar124 + 0.0;
          if (lVar111 < lVar108) {
            if (local_208 < lVar108) {
              switch(pbc->bc[4]) {
              case 0:
                break;
              case 1:
              case 2:
              case 4:
                dVar125 = dVar128;
                break;
              case 3:
                dVar125 = *(double *)((long)local_498 + lVar120 * 8);
                break;
              case -1:
                dVar128 = 0.0;
                dVar125 = 0.0;
                break;
              default:
                goto switchD_003829ce_default;
              }
            }
          }
          else {
            switch(pbc->bc[1]) {
            case 1:
            case 2:
            case 4:
              dVar128 = dVar125;
              break;
            case 3:
              dVar128 = *(double *)((long)local_510 + lVar120 * 8);
              break;
            case -1:
              dVar128 = 0.0;
              dVar125 = 0.0;
            }
          }
switchD_003829ce_default:
          uVar72 = -(ulong)(0.0 <= local_538[lVar120]);
          dVar129 = (double)(~-(ulong)(ABS(local_538[lVar120]) < 1e-08) & 0x3ff0000000000000);
          local_548[lVar120] =
               dVar129 * (double)(~uVar72 & (ulong)dVar125 | uVar72 & (ulong)dVar128) +
               (dVar125 + dVar128) * (1.0 - dVar129) * 0.5;
          lVar120 = lVar120 + 1;
        } while (iVar36 != (int)lVar120);
      }
      local_548 = local_548 + ((aiStack_2ac[0] + 2) - lVar94);
      local_538 = local_538 + lVar102;
      local_4f0 = local_4f0 + lVar90;
      lVar104 = lVar104 + lVar90;
      pdVar43 = pdVar43 + lVar85;
      pdVar25 = pdVar25 + lVar85;
      pdVar35 = pdVar35 + lVar85;
      pdVar45 = pdVar45 + lVar85;
      lVar100 = lVar100 + lVar79;
      lVar66 = lVar66 + lVar79;
      lVar105 = lVar105 + lVar79;
      lVar92 = lVar92 + lVar79;
      lVar22 = lVar22 + lVar21;
      lVar115 = lVar115 + lVar21;
    }
    local_4a0 = local_4a0 + lVar87;
    pdVar24 = pdVar24 + lVar70;
    local_498 = (double *)((long)local_498 + lVar23);
    local_510 = (double *)((long)local_510 + lVar23);
    lVar101 = lVar101 + lVar23;
    lVar42 = lVar42 + lVar23;
    local_490 = local_490 + lVar34;
    pdVar64 = pdVar64 + lVar34;
    pdVar107 = pdVar107 + lVar34;
    pdVar46 = pdVar46 + lVar34;
    lVar28 = lVar28 + lVar33;
    lVar78 = lVar78 + lVar33;
    local_500 = local_500 + lVar33;
    local_480 = local_480 + lVar33;
    local_508 = local_508 + lVar67;
    lVar103 = lVar103 + lVar67;
  }
  lVar28 = (long)(local_108->smallend).vect[2];
  lVar86 = local_60->kstride;
  iVar36 = (local_108->smallend).vect[0];
  lVar78 = (long)iVar36;
  local_4e8 = (long)local_200 +
              ((lVar78 * 8 + local_128 * (lVar28 - local_120) * 8) - local_148) + -8;
  lVar102 = (lVar28 - lVar50) * lVar27 * 8 + lVar84 * -8;
  local_498 = pdVar14 + ((lVar70 * (lVar28 - local_230) + lVar78 + -1) - lVar76);
  local_4e0 = local_60->p +
              (((lVar28 - (local_60->begin).z) * lVar86 + lVar78) - (long)(local_60->begin).x);
  lVar90 = local_60->jstride;
  iVar48 = (local_60->begin).y;
  iVar110 = (local_108->smallend).vect[1];
  iVar65 = (local_108->bigend).vect[0];
  iVar2 = (local_108->bigend).vect[1];
  iVar57 = (local_108->bigend).vect[2];
  dVar125 = l_dt * -0.25;
  dVar128 = dVar125 / local_110;
  dVar129 = dVar125 / local_118;
  lVar27 = local_1d4 - lVar78;
  local_478 = pdVar80 + (((lVar28 - lVar39) * lVar34 + lVar78 + -1) - lVar51);
  local_528 = pdVar80 + ((((lVar28 + 1) - lVar39) * lVar34 + lVar78 + -1) - lVar51);
  local_518 = local_228 + ((lVar78 + -1) - lVar94);
  local_4a0 = local_258 + ((lVar78 + -1) - lVar94);
  local_520 = (double *)((lVar78 * 8 - local_1b0) + (long)p);
  lVar23 = lVar28;
  do {
    if (iVar57 < lVar23) {
      uVar17 = *(undefined8 *)(local_1f8->smallend).vect;
      uVar18 = *(undefined8 *)((local_1f8->smallend).vect + 2);
      aiStack_2ac[1] = (int)((ulong)*(undefined8 *)(local_1f8->bigend).vect >> 0x20);
      uStack_2a4 = *(undefined8 *)((local_1f8->bigend).vect + 2);
      iStack_2b0 = (int)uVar18;
      aiStack_2ac[0] = (int)((ulong)uVar18 >> 0x20);
      for (lVar86 = 0; lVar86 != 3; lVar86 = lVar86 + 1) {
        if ((uStack_2a4._4_4_ >> ((uint)lVar86 & 0x1f) & 1) != 0) {
          aiStack_2ac[lVar86] = aiStack_2ac[lVar86] + -1;
        }
      }
      iStack_2b4 = (int)((ulong)uVar17 >> 0x20);
      lVar83 = (long)(iStack_2b4 + -1);
      lVar70 = (long)iStack_2b0;
      lVar28 = (lVar70 - lVar39) * lVar34;
      lVar41 = (lVar83 - lVar52) * local_250;
      lVar86 = lVar56 * (lVar83 - local_278) * 8;
      local_2b8 = (int)uVar17;
      lVar76 = (long)local_2b8;
      lVar78 = (long)pdVar44 +
               ((lVar86 + (lVar70 - lVar38) * lVar29 * 8 + local_100 * 8 + lVar76 * 8) - local_240)
               + -8;
      lVar84 = (long)pdVar44 +
               ((lVar86 + ((lVar70 + 1) - lVar38) * lVar29 * 8 + local_100 * 8 + lVar76 * 8) -
               local_240) + -8;
      pdVar109 = Ipy->p;
      iVar48 = aiStack_2ac[0] + 2;
      lVar66 = (long)((aiStack_2ac[1] - iStack_2b4) + 3);
      iVar36 = aiStack_2ac[0] + 1;
      lVar29 = (long)(iVar36 - local_2b8);
      pdVar14 = q->p;
      lVar90 = q->jstride;
      lVar113 = q->kstride;
      lVar23 = q->nstride;
      uVar1 = (q->begin).x;
      lVar102 = (long)(int)uVar1;
      uVar9 = (q->begin).y;
      lVar103 = (long)(int)uVar9;
      uVar10 = (q->begin).z;
      lVar94 = (long)(int)uVar10;
      pdVar24 = u_ad->p;
      lVar13 = u_ad->jstride;
      lVar87 = u_ad->kstride;
      lVar50 = (long)(u_ad->begin).x;
      lVar104 = (long)(u_ad->begin).y;
      lVar74 = (long)(u_ad->begin).z;
      lVar30 = (long)(iVar48 - local_2b8);
      lVar27 = lVar30 * lVar66 * 8;
      lVar42 = (long)iVar48 * 8 + lVar76 * -8;
      lVar31 = (lVar70 - lVar74) * lVar87;
      lVar91 = (lVar83 - lVar104) * lVar13;
      lVar32 = (lVar70 - lVar94) * lVar113;
      lVar38 = (lVar83 - lVar103) * lVar90;
      pdVar46 = pdVar80 + ((lVar76 + ((lVar70 + 1) - lVar39) * lVar34 + lVar41 + -1) - lVar51);
      lVar82 = (((((local_58 + lVar53 * local_248 * 8) - local_1b0) * local_260 +
                 (lVar70 - lVar20) * lVar53 * 8) * lVar93 + (lVar83 - lVar95) * lVar53 * 8 +
                lVar76 * 8) - local_1b0) + (long)p;
      lVar77 = ((((local_260 * 8 + lVar70 * 8 + lVar20 * -8) * lVar93 + lVar83 * 8 + lVar95 * -8) *
                 lVar53 + lVar76 * 8) - local_1b0) + (long)p;
      pdVar64 = pdVar24 + ((lVar76 + lVar31 + lVar91) - lVar50);
      pdVar44 = pdVar14 + ((lVar76 + lVar23 + lVar32 + lVar38 + -1) - lVar102);
      lVar86 = lVar90 * 8;
      pdVar107 = pdVar80 + ((lVar76 + lVar28 + lVar41 + -1) - lVar51);
      lVar56 = lVar70;
      local_520 = pdVar109;
      do {
        if ((int)uStack_2a4 < lVar56) {
          auVar15._8_4_ = SUB84(dVar128,0);
          auVar15._0_8_ = dVar128;
          auVar15._12_4_ = (int)((ulong)dVar128 >> 0x20);
          dVar122 = dVar122 / (local_1b8 * 3.0);
          dVar123 = l_dt / (local_1b8 * 3.0);
          lVar79 = lVar29 * lVar66 * 8;
          lVar78 = (long)iVar36 * 8 + lVar76 * -8;
          local_4c0 = pdVar80 + ((lVar76 + lVar28 + lVar41) - lVar51);
          local_428 = pdVar14 + ((lVar76 + lVar23 + lVar32 + lVar38) - lVar102);
          lVar33 = lVar70 + -1;
          pdVar46 = pdVar14 + ((lVar76 + lVar23 + (lVar33 - lVar94) * lVar113 + lVar38) - lVar102);
          pdVar107 = pdVar24 + ((lVar76 + lVar31 + lVar91 + 1) - lVar50);
          pdVar44 = pdVar24 + ((lVar76 + (lVar33 - lVar74) * lVar87 + lVar91 + 1) - lVar50);
          lVar56 = (lVar83 - local_c8) * local_168 * 8;
          lVar31 = (long)local_d8 +
                   ((lVar56 + (lVar70 - local_d0) * local_160 * 8 + local_170 * 8 + lVar76 * 8) -
                   local_e0) + 8;
          lVar32 = (long)local_d8 +
                   ((lVar56 + (lVar33 - local_d0) * local_160 * 8 + local_170 * 8 + lVar76 * 8) -
                   local_e0) + 8;
          lVar33 = ((local_158 * 8 + lVar70 * 8 + local_220 * -8) * lVar93 + lVar83 * 8 +
                   lVar95 * -8) * lVar37;
          lVar28 = local_1f0 + lVar33 + lVar76 * 8 + lVar106 * -8 + (long)p;
          lVar56 = lVar33 + local_268 + lVar76 * 8 + lVar106 * -8 + (long)p;
          pdVar64 = local_258;
          for (lVar33 = lVar70; lVar84 = lVar32, pdVar43 = pdVar46, pdVar25 = local_428,
              lVar41 = lVar83, pdVar45 = pdVar44, pdVar35 = local_4c0, lVar91 = lVar31,
              pdVar47 = pdVar107, lVar40 = lVar28, lVar77 = lVar56, pdVar59 = pdVar64,
              local_548 = pdVar14 + ((lVar76 + lVar23 + lVar38 + (int)(~uVar10 + iVar8) * lVar113) -
                                    lVar102),
              local_540 = pdVar14 + ((lVar76 + lVar23 + lVar38 + (int)(local_1cc - uVar10) * lVar113
                                     ) - lVar102), lVar33 <= (int)uStack_2a4 + 1;
              lVar33 = lVar33 + 1) {
            for (; lVar41 <= (long)aiStack_2ac[1] + 1; lVar41 = lVar41 + 1) {
              if (local_2b8 <= aiStack_2ac[0]) {
                lVar82 = 0;
                do {
                  dVar124 = *(double *)(lVar77 + lVar82 * 8) +
                            (*(double *)(lVar84 + lVar82 * 8) * pdVar45[lVar82] -
                            *(double *)(lVar84 + -8 + lVar82 * 8) * pdVar45[lVar82 + -1]) * dVar122
                            + (pdVar45[lVar82] - pdVar45[lVar82 + -1]) * pdVar43[lVar82] * dVar123 +
                            0.0;
                  dVar131 = *(double *)(lVar40 + lVar82 * 8) +
                            (*(double *)(lVar91 + lVar82 * 8) * pdVar47[lVar82] -
                            *(double *)(lVar91 + -8 + lVar82 * 8) * pdVar47[lVar82 + -1]) * dVar122
                            + (pdVar47[lVar82] - pdVar47[lVar82 + -1]) * pdVar25[lVar82] * dVar123 +
                            0.0;
                  if (lVar112 < lVar33) {
                    if (lVar96 < lVar33) {
                      switch(pbc[1].bc[5]) {
                      case 0:
                        break;
                      case 1:
                      case 2:
                      case 4:
                        dVar131 = dVar124;
                        break;
                      case 3:
                        dVar131 = local_540[lVar82];
                        break;
                      case -1:
                        dVar124 = 0.0;
                        dVar131 = 0.0;
                        break;
                      default:
                        goto switchD_00383fcc_default;
                      }
                    }
                  }
                  else {
                    switch(pbc[1].bc[2]) {
                    case 1:
                    case 2:
                    case 4:
                      dVar124 = dVar131;
                      break;
                    case 3:
                      dVar124 = local_548[lVar82];
                      break;
                    case -1:
                      dVar124 = 0.0;
                      dVar131 = 0.0;
                    }
                  }
switchD_00383fcc_default:
                  uVar72 = -(ulong)(0.0 <= pdVar35[lVar82]);
                  dVar132 = (double)(~-(ulong)(ABS(pdVar35[lVar82]) < 1e-08) & 0x3ff0000000000000);
                  pdVar59[lVar82] =
                       dVar132 * (double)(~uVar72 & (ulong)dVar131 | uVar72 & (ulong)dVar124) +
                       (dVar131 + dVar124) * (1.0 - dVar132) * 0.5;
                  lVar82 = lVar82 + 1;
                } while (iVar36 - local_2b8 != (int)lVar82);
              }
              lVar84 = lVar84 + (long)local_238;
              pdVar43 = pdVar43 + lVar90;
              pdVar25 = pdVar25 + lVar90;
              pdVar45 = pdVar45 + lVar13;
              pdVar35 = pdVar35 + lVar85;
              lVar91 = lVar91 + (long)local_238;
              pdVar47 = pdVar47 + lVar13;
              lVar40 = lVar40 + lVar21;
              lVar77 = lVar77 + lVar21;
              pdVar59 = pdVar59 + (iVar36 - lVar76);
              local_548 = local_548 + lVar90;
              local_540 = local_540 + lVar90;
            }
            pdVar64 = pdVar64 + lVar29 * lVar66;
            local_4c0 = local_4c0 + lVar34;
            local_428 = local_428 + lVar113;
            pdVar46 = pdVar46 + lVar113;
            pdVar107 = pdVar107 + lVar87;
            pdVar44 = pdVar44 + lVar87;
            lVar31 = lVar31 + local_1e0;
            lVar32 = lVar32 + local_1e0;
            lVar28 = lVar28 + lVar75;
            lVar56 = lVar56 + lVar75;
          }
          local_430 = (long)(local_1f8->smallend).vect[2];
          lVar41 = (local_430 - lVar94) * lVar113;
          iVar36 = (local_1f8->smallend).vect[1];
          lVar40 = (long)iVar36;
          lVar31 = qy->kstride;
          lVar32 = qy->jstride;
          iVar48 = (local_1f8->smallend).vect[0];
          lVar96 = (long)iVar48;
          pdVar64 = qy->p + ((lVar96 + (local_430 - (qy->begin).z) * lVar31 +
                                       (lVar40 - (qy->begin).y) * lVar32) - (long)(qy->begin).x);
          lVar91 = (long)(f->begin).y;
          lVar28 = f->jstride;
          lVar82 = (long)(f->begin).z;
          lVar84 = f->kstride;
          lVar77 = (local_430 - lVar82) * lVar84;
          lVar33 = lVar40 + -1;
          lVar56 = (local_430 - lVar39) * lVar34;
          lVar38 = ((local_430 + 1) - lVar39) * lVar34;
          lVar39 = (lVar40 - lVar52) * local_250;
          local_250 = (lVar33 - lVar52) * local_250;
          pdVar25 = pdVar80 + ((lVar96 + lVar39 + lVar56) - lVar51);
          pdVar43 = pdVar80 + ((lVar96 + lVar38 + lVar39) - lVar51);
          pdVar44 = pdVar80 + ((lVar96 + local_250 + lVar56) - lVar51);
          pdVar80 = pdVar80 + ((lVar96 + local_250 + lVar38) - lVar51);
          lVar56 = lVar40 * 8;
          lVar39 = lVar56 + (local_430 - lVar70) * lVar66 * 8 + lVar83 * -8;
          lVar70 = lVar56 + ((local_430 + 1) - lVar70) * lVar66 * 8 + lVar83 * -8;
          local_4c8 = (lVar39 + -8) * lVar29 + lVar96 * 8 + lVar76 * -8 + (long)local_258;
          local_4d0 = (lVar70 + -8) * lVar29 + lVar96 * 8 + lVar76 * -8 + (long)local_258;
          local_4b0 = lVar39 * lVar29 + lVar96 * 8 + lVar76 * -8 + (long)local_258;
          local_440 = lVar70 * lVar29 + lVar96 * 8 + lVar76 * -8 + (long)local_258;
          lVar70 = (local_430 - lVar74) * lVar87;
          lVar52 = (lVar56 + (local_430 - lVar20) * local_198 * 8 + lVar58 * -8) * lVar37;
          lVar38 = local_190 * local_248 * 0x10;
          local_510 = f->p;
          lVar29 = f->nstride;
          lVar51 = (long)(f->begin).x;
          iVar110 = (local_1f8->bigend).vect[0];
          iVar65 = (local_1f8->bigend).vect[1];
          iVar2 = (local_1f8->bigend).vect[2];
          dVar125 = dVar125 / local_1b8;
          local_528 = pdVar14 + ((lVar96 + lVar41 + lVar23) - lVar102);
          local_3b8 = pdVar14 + (((lVar40 - lVar103) * lVar90 + lVar96 + lVar41 + lVar23) - lVar102)
          ;
          local_450 = local_510 + ((lVar96 + lVar29 + (lVar40 - lVar91) * lVar28 + lVar77) - lVar51)
          ;
          local_410 = local_510 + ((lVar96 + lVar29 + (lVar33 - lVar91) * lVar28 + lVar77) - lVar51)
          ;
          lVar41 = (long)pdVar109 + lVar39 * lVar30 + lVar96 * 8 + lVar76 * -8 + 8;
          lVar56 = (lVar39 + -8) * lVar30 + lVar96 * 8 + lVar76 * -8 + 8 + (long)pdVar109;
          pdVar46 = pdVar24 + ((lVar96 + lVar70 + (lVar40 - lVar104) * lVar13 + 1) - lVar50);
          pdVar107 = pdVar24 + ((lVar96 + (lVar33 - lVar104) * lVar13 + lVar70 + 1) - lVar50);
          local_3e8 = (local_1e8 * local_248 + local_f8 * 8) * local_260 + lVar52 + lVar96 * 8 +
                      lVar106 * -8 + (long)p;
          local_3f0 = (lVar38 + local_f8 * 8) * local_260 + lVar52 + lVar96 * 8 + lVar106 * -8 +
                      (long)p;
          do {
            if (iVar2 < local_430) {
              uVar17 = *(undefined8 *)(local_c0->smallend).vect;
              uVar18 = *(undefined8 *)((local_c0->smallend).vect + 2);
              aiStack_2ac[1] = (int)((ulong)*(undefined8 *)(local_c0->bigend).vect >> 0x20);
              uStack_2a4 = *(undefined8 *)((local_c0->bigend).vect + 2);
              iStack_2b0 = (int)uVar18;
              aiStack_2ac[0] = (int)((ulong)uVar18 >> 0x20);
              for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
                if ((uStack_2a4._4_4_ >> ((uint)lVar33 & 0x1f) & 1) != 0) {
                  aiStack_2ac[lVar33] = aiStack_2ac[lVar33] + -1;
                }
              }
              lVar78 = (long)(iStack_2b0 + -1);
              local_2b8 = (int)uVar17;
              lVar42 = (long)local_2b8;
              local_4b8 = (double *)
                          ((long)local_178 +
                          ((local_f0 * 0x10 + local_1a8 * (lVar78 - local_180) * 8 + lVar42 * 8) -
                          local_1a0) + -8);
              iStack_2b4 = (int)((ulong)uVar17 >> 0x20);
              lVar39 = (long)iStack_2b4;
              iVar48 = (aiStack_2ac[0] - local_2b8) + 2;
              lVar70 = (long)((aiStack_2ac[1] + 1) - iStack_2b4);
              pdVar64 = Ipz->p;
              iVar36 = aiStack_2ac[0] + 1;
              lVar34 = (long)((aiStack_2ac[1] - iStack_2b4) + 2);
              pdVar44 = v_ad->p;
              lVar33 = v_ad->jstride;
              lVar56 = v_ad->kstride;
              lVar40 = (long)(v_ad->begin).x;
              lVar31 = (long)(v_ad->begin).y;
              lVar41 = (long)(v_ad->begin).z;
              lVar79 = (long)iVar48;
              lVar30 = (lVar78 - lVar74) * lVar87;
              local_420 = pdVar24 + ((lVar30 + lVar42) - lVar50);
              lVar32 = (lVar78 - lVar94) * lVar113;
              local_3d0 = pdVar14 + ((lVar42 + lVar32 + lVar23 * 2 + -1) - lVar102);
              lVar27 = (lVar78 - lVar41) * lVar56;
              local_470 = pdVar44 + ((lVar27 + lVar42 + -1) - lVar40);
              local_4c0 = (double *)
                          (((((local_e8 * 0x10 + lVar53 * local_248 * 8 + lVar19 * -0x10) *
                              local_260 + lVar53 * (lVar78 - lVar20) * 8) * lVar93 + lVar42 * 8) -
                           local_1b0) + (long)p);
              local_520 = (double *)((lVar42 * 8 - local_1b0) + (long)p);
              lVar19 = lVar33 * 8;
              lVar85 = lVar78;
              local_458 = pdVar109;
              do {
                if ((long)(int)uStack_2a4 + 1 < lVar85) {
                  lVar116 = lVar39 + -1;
                  lVar85 = local_160 * (lVar78 - local_d0) * 8;
                  lVar49 = (long)local_d8 +
                           ((lVar85 + (lVar39 - local_c8) * local_168 * 8 + local_170 * 0x10 +
                            lVar42 * 8) - local_e0) + 8;
                  lVar85 = (long)local_d8 +
                           ((lVar85 + (lVar116 - local_c8) * local_168 * 8 + local_170 * 0x10 +
                            lVar42 * 8) - local_e0) + 8;
                  lVar58 = (lVar39 * 8 + (lVar78 - lVar20) * local_198 * 8 + lVar58 * -8) * lVar37;
                  lVar20 = (long)(iVar36 - local_2b8);
                  pdVar46 = pdVar44 + ((lVar42 + lVar33 * (lVar39 - lVar31) + lVar27) - lVar40);
                  local_538 = pdVar14 + ((lVar42 + lVar23 * 2 +
                                                   lVar32 + (int)(local_1d0 - uVar9) * lVar90) -
                                        lVar102);
                  local_418 = pdVar14 + ((lVar42 + lVar23 * 2 +
                                                   lVar32 + (int)(~uVar9 + iVar7) * lVar90) -
                                        lVar102);
                  pdVar107 = pdVar14 + ((lVar42 + lVar23 * 2 + (lVar39 - lVar103) * lVar90 + lVar32)
                                       - lVar102);
                  pdVar25 = pdVar14 + ((lVar42 + lVar23 * 2 + (lVar116 - lVar103) * lVar90 + lVar32)
                                      - lVar102);
                  pdVar45 = pdVar24 + ((lVar42 + (lVar39 - lVar104) * lVar13 + lVar30 + 1) - lVar50)
                  ;
                  pdVar43 = pdVar24 + ((lVar42 + (lVar116 - lVar104) * lVar13 + lVar30 + 1) - lVar50
                                      );
                  lVar30 = (local_1e8 * local_248 + local_50) * local_260 + lVar58 + lVar42 * 8 +
                           lVar106 * -8 + (long)p;
                  lVar116 = (lVar38 + local_50) * local_260 + lVar58 + lVar42 * 8 + lVar106 * -8 +
                            (long)p;
                  pdVar80 = pdVar64;
                  for (lVar58 = lVar78; pdVar35 = pdVar80, pdVar47 = pdVar46, lVar27 = lVar85,
                      pdVar59 = pdVar45, lVar32 = lVar116, pdVar26 = pdVar107, lVar38 = lVar39,
                      pdVar55 = pdVar43, pdVar54 = pdVar25, lVar52 = lVar49, lVar53 = lVar30,
                      lVar58 <= (long)(int)uStack_2a4 + 1; lVar58 = lVar58 + 1) {
                    for (; lVar38 <= aiStack_2ac[1] + 1; lVar38 = lVar38 + 1) {
                      if (local_2b8 <= aiStack_2ac[0]) {
                        lVar73 = 0;
                        do {
                          dVar126 = *(double *)(lVar32 + lVar73 * 8) +
                                    (*(double *)(lVar27 + lVar73 * 8) * pdVar55[lVar73] -
                                    *(double *)(lVar27 + -8 + lVar73 * 8) * pdVar55[lVar73 + -1]) *
                                    dVar122 + (pdVar55[lVar73] - pdVar55[lVar73 + -1]) *
                                              pdVar54[lVar73] * dVar123 + 0.0;
                          dVar127 = *(double *)(lVar53 + lVar73 * 8) +
                                    (*(double *)(lVar52 + lVar73 * 8) * pdVar59[lVar73] -
                                    *(double *)(lVar52 + -8 + lVar73 * 8) * pdVar59[lVar73 + -1]) *
                                    dVar122 + (pdVar59[lVar73] - pdVar59[lVar73 + -1]) *
                                              pdVar26[lVar73] * dVar123 + 0.0;
                          if (lVar111 < lVar38) {
                            if (local_208 < lVar38) {
                              switch(pbc[2].bc[4]) {
                              case 0:
                                break;
                              case 1:
                              case 2:
                              case 4:
                                dVar127 = dVar126;
                                break;
                              case 3:
                                dVar127 = local_538[lVar73];
                                break;
                              case -1:
                                dVar126 = 0.0;
                                dVar127 = 0.0;
                                break;
                              default:
                                goto switchD_003857cc_default;
                              }
                            }
                          }
                          else {
                            switch(pbc[2].bc[1]) {
                            case 1:
                            case 2:
                            case 4:
                              dVar126 = dVar127;
                              break;
                            case 3:
                              dVar126 = local_418[lVar73];
                              break;
                            case -1:
                              dVar126 = 0.0;
                              dVar127 = 0.0;
                            }
                          }
switchD_003857cc_default:
                          uVar72 = -(ulong)(0.0 <= pdVar47[lVar73]);
                          dVar124 = (double)(~-(ulong)(ABS(pdVar47[lVar73]) < 1e-08) &
                                            0x3ff0000000000000);
                          pdVar35[lVar73] =
                               dVar124 * (double)(~uVar72 & (ulong)dVar127 | uVar72 & (ulong)dVar126
                                                 ) + (dVar127 + dVar126) * (1.0 - dVar124) * 0.5;
                          lVar73 = lVar73 + 1;
                        } while (iVar36 - local_2b8 != (int)lVar73);
                      }
                      pdVar35 = pdVar35 + (iVar36 - lVar42);
                      pdVar47 = pdVar47 + lVar33;
                      lVar27 = lVar27 + (long)local_238;
                      pdVar59 = pdVar59 + lVar13;
                      lVar32 = lVar32 + lVar21;
                      pdVar26 = pdVar26 + lVar90;
                      pdVar55 = pdVar55 + lVar13;
                      pdVar54 = pdVar54 + lVar90;
                      lVar52 = lVar52 + (long)local_238;
                      lVar53 = lVar53 + lVar21;
                    }
                    pdVar80 = pdVar80 + lVar20 * lVar34;
                    pdVar46 = pdVar46 + lVar56;
                    local_538 = local_538 + lVar113;
                    local_418 = local_418 + lVar113;
                    pdVar107 = pdVar107 + lVar113;
                    pdVar25 = pdVar25 + lVar113;
                    pdVar45 = pdVar45 + lVar87;
                    pdVar43 = pdVar43 + lVar87;
                    lVar49 = lVar49 + local_1e0;
                    lVar85 = lVar85 + local_1e0;
                    lVar30 = lVar30 + lVar67;
                    lVar116 = lVar116 + lVar67;
                  }
                  iVar36 = (local_c0->smallend).vect[2];
                  lVar33 = (long)iVar36;
                  iVar48 = (local_c0->smallend).vect[0];
                  lVar85 = (long)iVar48;
                  local_468 = pdVar14 + ((lVar113 * (lVar33 - lVar94) + lVar85 + lVar23 * 2) -
                                        lVar102);
                  lVar67 = qz->kstride;
                  lVar90 = lVar33 + -1;
                  local_420 = local_510 +
                              ((lVar85 + (lVar33 - lVar82) * lVar84 + lVar29 * 2) - lVar51);
                  local_510 = local_510 +
                              ((lVar85 + (lVar90 - lVar82) * lVar84 + lVar29 * 2) - lVar51);
                  local_3d0 = pdVar44 + (((lVar33 - lVar41) * lVar56 + lVar85) - lVar40);
                  local_470 = pdVar44 + (((lVar90 - lVar41) * lVar56 + lVar85) - lVar40);
                  lVar78 = lVar33 - lVar78;
                  iStack_2b0 = iVar36 - iStack_2b0;
                  lVar58 = lVar33 * 8;
                  pdVar64 = pdVar64 + (lVar85 - lVar42);
                  pdVar109 = pdVar109 + ((lVar85 + 1) - lVar42);
                  local_458 = (double *)(local_268 + lVar85 * 8 + lVar106 * -8 + (long)p);
                  local_4c0 = (double *)(local_1f0 + lVar85 * 8 + lVar106 * -8 + (long)p);
                  local_3a0 = pdVar24 + (((lVar90 - lVar74) * lVar87 + lVar85 + 1) - lVar50);
                  local_520 = pdVar24 + (((lVar33 - lVar74) * lVar87 + lVar85 + 1) - lVar50);
                  local_238 = qz->p + (((lVar33 - (qz->begin).z) * lVar67 + lVar85) -
                                      (long)(qz->begin).x);
                  lVar90 = qz->jstride;
                  iVar110 = (qz->begin).y;
                  iVar65 = (local_c0->smallend).vect[1];
                  iVar2 = (local_c0->bigend).vect[0];
                  iVar57 = (local_c0->bigend).vect[1];
                  iVar117 = (local_c0->bigend).vect[2];
                  iVar36 = ~uVar10 + iVar36;
                  lVar116 = lVar78 * lVar34 * 8 + lVar39 * -8;
                  dStack_140 = auVar15._8_8_;
                  local_4b8 = pdVar109;
                  local_360 = pdVar64;
                  do {
                    if (iVar117 < lVar33) {
                      return;
                    }
                    lVar30 = (long)iStack_2b0;
                    lVar29 = (long)iVar65;
                    while (lVar29 <= iVar57) {
                      if (iVar2 < iVar48) {
                        lVar29 = lVar29 + 1;
                      }
                      else {
                        lVar27 = lVar29 + 1;
                        lVar53 = lVar29 - iVar110;
                        lVar40 = (lVar29 - lVar103) * lVar86;
                        lVar38 = (lVar29 - lVar91) * lVar28 * 8;
                        lVar51 = (lVar29 - lVar31) * lVar19;
                        lVar49 = (lVar27 - lVar31) * lVar19;
                        lVar32 = lVar29 * 8;
                        lVar21 = lVar34 * lVar30 + lVar29;
                        lVar41 = lVar29 * 8;
                        lVar42 = lVar29 * 8;
                        lVar50 = ((local_158 * 0x10 + lVar58 + local_220 * -8) * lVar93 +
                                  lVar95 * -8 + lVar29 * 8) * lVar37;
                        lVar52 = (lVar30 * lVar70 * 8 + lVar39 * -8 + lVar29 * 8) * lVar79;
                        lVar73 = (lVar29 - lVar104) * lVar13 * 8;
                        lVar76 = (lVar78 * lVar70 * 8 + lVar39 * -8 + lVar29 * 8) * lVar79;
                        lVar74 = 0;
                        do {
                          dVar122 = (*(double *)((long)local_470 + lVar74 * 8 + lVar51) +
                                    *(double *)((long)local_470 + lVar74 * 8 + lVar49)) * dVar128 *
                                    (*(double *)
                                      ((long)pdVar64 +
                                      lVar74 * 8 + (lVar39 * -8 + 8 + lVar21 * 8) * lVar20) -
                                    *(double *)
                                     ((long)pdVar64 +
                                     lVar74 * 8 +
                                     (lVar34 * 8 * lVar30 + lVar39 * -8 + lVar42) * lVar20)) +
                                    *(double *)((long)local_458 + lVar50 + lVar74 * 8) +
                                    (*(double *)((long)local_3a0 + lVar74 * 8 + lVar73 + -8) +
                                    *(double *)((long)local_3a0 + lVar74 * 8 + lVar73)) * dVar125 *
                                    (*(double *)((long)pdVar109 + lVar74 * 8 + lVar52) -
                                    *(double *)((long)pdVar109 + lVar74 * 8 + lVar52 + -8));
                          dVar126 = (*(double *)((long)local_3d0 + lVar74 * 8 + lVar51) +
                                    *(double *)((long)local_3d0 + lVar74 * 8 + lVar49)) * dStack_140
                                    * (*(double *)
                                        ((long)local_360 +
                                        lVar74 * 8 + (lVar116 + 8 + lVar32) * lVar20) -
                                      *(double *)
                                       ((long)local_360 + lVar74 * 8 + (lVar116 + lVar41) * lVar20))
                                    + *(double *)(lVar50 + (long)local_4c0 + lVar74 * 8) +
                                      (*(double *)((long)local_520 + lVar74 * 8 + lVar73 + -8) +
                                      *(double *)((long)local_520 + lVar74 * 8 + lVar73)) * dVar125
                                      * (*(double *)((long)local_4b8 + lVar74 * 8 + lVar76) -
                                        *(double *)((long)local_4b8 + lVar74 * 8 + lVar76 + -8));
                          if (!l_use_forces_in_trans) {
                            dVar122 = dVar122 + *(double *)((long)local_510 + lVar74 * 8 + lVar38) *
                                                dVar130;
                            dVar126 = dVar126 + *(double *)((long)local_420 + lVar74 * 8 + lVar38) *
                                                dVar134;
                          }
                          iVar3 = pbc[2].bc[5];
                          if (lVar33 == lVar112) {
                            dVar123 = dVar126;
                            switch(pbc[2].bc[2]) {
                            case 1:
                              dVar122 = dVar126;
                              break;
                            case 2:
                            case 4:
                              dVar122 = 0.0;
                              dVar123 = 0.0;
                              if (dVar126 <= 0.0) {
                                dVar122 = dVar126;
                                dVar123 = dVar126;
                              }
                              break;
                            case 3:
                              dVar122 = *(double *)
                                         ((long)pdVar14 +
                                         lVar74 * 8 +
                                         lVar40 + (long)iVar36 * lVar113 * 8 +
                                                  lVar23 * 0x10 + lVar85 * 8 + lVar102 * -8);
                              dVar123 = dVar122;
                              break;
                            case -1:
                              dVar122 = 0.0;
                              dVar123 = 0.0;
                            }
                            dVar127 = dVar122;
                            dVar126 = dVar123;
                            if (lVar33 == local_1cc) goto switchD_003860e5_caseD_0;
                          }
                          else {
                            dVar127 = dVar122;
                            if (lVar33 == local_1cc) {
                              switch(iVar3) {
                              case 1:
                              case 2:
                              case 4:
                                dVar126 = dVar122;
                              default:
switchD_003860e5_caseD_0:
                                if (((iVar3 == 4) || (dVar127 = dVar122, iVar3 == 2)) &&
                                   (dVar127 = 0.0, dVar126 = 0.0, 0.0 <= dVar122)) {
                                  dVar127 = dVar122;
                                  dVar126 = dVar122;
                                }
                                break;
                              case 3:
                                dVar127 = *(double *)((long)local_468 + lVar74 * 8 + lVar40);
                                dVar126 = dVar127;
                                break;
                              case -1:
                                dVar127 = 0.0;
                                dVar126 = 0.0;
                              }
                            }
                          }
                          if (((dVar127 <= 0.0) && (0.0 <= dVar126)) ||
                             (ABS(dVar126 + dVar127) < 1e-08)) {
                            uVar72 = 0;
                          }
                          else {
                            uVar72 = -(ulong)(0.0 <= dVar126 + dVar127);
                            uVar72 = ~uVar72 & (ulong)dVar126 | (ulong)dVar127 & uVar72;
                          }
                          *(ulong *)((long)local_238 + lVar74 * 8 + lVar53 * lVar90 * 8) = uVar72;
                          lVar74 = lVar74 + 1;
                          lVar29 = lVar27;
                        } while ((iVar2 - iVar48) + 1 != (int)lVar74);
                      }
                    }
                    lVar33 = lVar33 + 1;
                    iVar36 = iVar36 + 1;
                    local_468 = local_468 + lVar113;
                    local_238 = local_238 + lVar67;
                    local_420 = local_420 + lVar84;
                    local_510 = local_510 + lVar84;
                    local_3d0 = local_3d0 + lVar56;
                    local_470 = local_470 + lVar56;
                    local_360 = local_360 + lVar20 * lVar34;
                    iStack_2b0 = iStack_2b0 + 1;
                    local_458 = (double *)((long)local_458 + lVar75);
                    local_4c0 = (double *)((long)local_4c0 + lVar75);
                    local_3a0 = local_3a0 + lVar87;
                    local_4b8 = local_4b8 + lVar79 * lVar70;
                    local_520 = local_520 + lVar87;
                  } while( true );
                }
                lVar76 = (lVar85 - lVar94) * lVar113;
                lVar52 = lVar39;
                while (lVar52 <= aiStack_2ac[1]) {
                  if (iVar36 < local_2b8) {
                    lVar52 = lVar52 + 1;
                  }
                  else {
                    lVar22 = lVar52 - lVar95;
                    lVar77 = lVar52 + 1;
                    lVar108 = lVar52 - local_218;
                    lVar92 = lVar52 - lVar31;
                    lVar100 = lVar52 - lVar103;
                    lVar96 = lVar100 * lVar90;
                    lVar66 = lVar52 - lVar104;
                    lVar105 = lVar52 - lVar39;
                    lVar83 = lVar52 * 8;
                    lVar101 = 0;
                    do {
                      pdVar80 = (double *)
                                ((lVar77 - local_218) * lVar49 + (long)local_4b8 + lVar101 * 8);
                      pdVar107 = (double *)
                                 ((long)local_470 + lVar101 * 8 + (lVar77 - lVar31) * lVar19);
                      dVar124 = *pdVar107;
                      dVar129 = pdVar107[1];
                      pdVar46 = (double *)(lVar108 * lVar49 + (long)local_4b8 + lVar101 * 8);
                      pdVar107 = (double *)((long)local_470 + lVar101 * 8 + lVar92 * lVar19);
                      dVar131 = *pdVar107;
                      dVar132 = pdVar107[1];
                      pdVar107 = (double *)((long)local_3d0 + lVar101 * 8 + lVar100 * lVar86);
                      dVar124 = *(double *)
                                 (((local_260 * 0x10 + lVar78 * 8 + lVar20 * -8) * lVar93 +
                                   lVar95 * -8 + lVar83) * lVar53 + (long)local_520 + lVar101 * 8) +
                                (*pdVar80 * dVar124 - *pdVar46 * dVar131) * dVar126 +
                                (dVar124 - dVar131) * *pdVar107 * dVar127 + 0.0;
                      dVar129 = *(double *)(lVar22 * lVar53 * 8 + (long)local_4c0 + lVar101 * 8) +
                                (pdVar80[1] * dVar129 - pdVar46[1] * dVar132) * dVar126 +
                                (dVar129 - dVar132) * pdVar107[1] * dVar127 + 0.0;
                      if (lVar73 < lVar42 + lVar101) {
                        if (lVar118 < lVar42 + lVar101) {
                          switch(pbc[2].bc[3]) {
                          case 1:
                          case 2:
                          case 4:
                            dVar129 = dVar124;
                            break;
                          case 3:
                            dVar129 = pdVar14[lVar96 + (long)(int)(local_1d4 - uVar1) +
                                                       lVar76 + lVar23 * 2];
                            break;
                          case -1:
                            goto switchD_003851d5_caseD_ffffffff;
                          }
                        }
                      }
                      else {
                        switch(pbc[2].bc[0]) {
                        case 1:
                        case 2:
                        case 4:
                          dVar124 = dVar129;
                          break;
                        case 3:
                          dVar124 = pdVar14[lVar96 + (long)(int)(~uVar1 + iVar88) +
                                                     lVar76 + lVar23 * 2];
                          break;
                        case -1:
switchD_003851d5_caseD_ffffffff:
                          dVar129 = 0.0;
                          dVar124 = 0.0;
                        }
                      }
                      dVar131 = *(double *)((long)local_420 + lVar101 * 8 + lVar66 * lVar13 * 8);
                      uVar72 = -(ulong)(0.0 <= dVar131);
                      dVar131 = (double)(~-(ulong)(ABS(dVar131) < 1e-08) & 0x3ff0000000000000);
                      *(double *)((long)local_458 + lVar101 * 8 + lVar105 * lVar79 * 8) =
                           dVar131 * (double)(~uVar72 & (ulong)dVar129 | uVar72 & (ulong)dVar124) +
                           (dVar129 + dVar124) * (1.0 - dVar131) * 0.5;
                      lVar101 = lVar101 + 1;
                      lVar52 = lVar77;
                    } while (iVar48 != (int)lVar101);
                  }
                }
                lVar85 = lVar85 + 1;
                local_458 = local_458 + lVar79 * lVar70;
                local_420 = local_420 + lVar87;
                local_3d0 = local_3d0 + lVar113;
                local_470 = local_470 + lVar56;
                local_4b8 = (double *)((long)local_4b8 + lVar116);
                local_4c0 = (double *)((long)local_4c0 + local_210);
                local_520 = (double *)((long)local_520 + local_210);
              } while( true );
            }
            local_430 = local_430 + 1;
            local_418 = (double *)local_3e8;
            local_4d8 = local_440;
            local_538 = (double *)local_4b0;
            local_548 = (double *)local_4d0;
            local_530 = local_4c8;
            local_398 = local_410;
            local_4b8 = local_450;
            local_420 = local_3b8;
            pdVar45 = pdVar44;
            pdVar35 = pdVar107;
            lVar33 = local_3f0;
            pdVar47 = pdVar46;
            pdVar59 = pdVar43;
            lVar70 = lVar56;
            pdVar26 = pdVar64;
            lVar39 = lVar41;
            pdVar55 = pdVar80;
            pdVar54 = pdVar25;
            iVar57 = ~uVar9 + iVar36;
            for (lVar30 = lVar40; lVar30 <= iVar65; lVar30 = lVar30 + 1) {
              if (iVar48 <= iVar110) {
                lVar52 = 0;
                do {
                  dVar124 = (pdVar45[lVar52] + pdVar55[lVar52]) * dVar129 *
                            (*(double *)((long)local_548 + lVar52 * 8) -
                            *(double *)(local_530 + lVar52 * 8)) +
                            *(double *)(lVar33 + lVar52 * 8) +
                            (pdVar35[lVar52 + -1] + pdVar35[lVar52]) * dVar125 *
                            (*(double *)(lVar70 + lVar52 * 8) -
                            *(double *)(lVar70 + -8 + lVar52 * 8));
                  dVar131 = (pdVar54[lVar52] + pdVar59[lVar52]) * dVar129 *
                            (*(double *)(local_4d8 + lVar52 * 8) -
                            *(double *)((long)local_538 + lVar52 * 8)) +
                            *(double *)((long)local_418 + lVar52 * 8) +
                            (pdVar47[lVar52 + -1] + pdVar47[lVar52]) * dVar125 *
                            (*(double *)(lVar39 + lVar52 * 8) -
                            *(double *)(lVar39 + -8 + lVar52 * 8));
                  if (!l_use_forces_in_trans) {
                    dVar124 = dVar124 + local_398[lVar52] * dVar130;
                    dVar131 = dVar131 + local_4b8[lVar52] * dVar134;
                  }
                  iVar117 = pbc[1].bc[4];
                  if (lVar30 == lVar111) {
                    dVar133 = dVar131;
                    switch(pbc[1].bc[1]) {
                    case 1:
                      dVar124 = dVar131;
                      break;
                    case 2:
                    case 4:
                      dVar124 = 0.0;
                      dVar133 = 0.0;
                      if (dVar131 <= 0.0) {
                        dVar124 = dVar131;
                        dVar133 = dVar131;
                      }
                      break;
                    case 3:
                      dVar124 = *(double *)((long)local_528 + lVar52 * 8 + iVar57 * lVar86);
                      dVar133 = dVar124;
                      break;
                    case -1:
                      dVar124 = 0.0;
                      dVar133 = 0.0;
                    }
                    dVar132 = dVar124;
                    dVar131 = dVar133;
                    if (lVar30 == local_1d0) goto switchD_00384a5a_caseD_0;
                  }
                  else {
                    dVar132 = dVar124;
                    if (lVar30 == local_1d0) {
                      switch(iVar117) {
                      case 1:
                      case 2:
                      case 4:
                        dVar131 = dVar124;
                      default:
switchD_00384a5a_caseD_0:
                        if (((iVar117 == 4) || (dVar132 = dVar124, iVar117 == 2)) &&
                           (dVar132 = 0.0, dVar131 = 0.0, 0.0 <= dVar124)) {
                          dVar132 = dVar124;
                          dVar131 = dVar124;
                        }
                        break;
                      case 3:
                        dVar132 = local_420[lVar52];
                        dVar131 = local_420[lVar52];
                        break;
                      case -1:
                        dVar132 = 0.0;
                        dVar131 = 0.0;
                      }
                    }
                  }
                  if (((dVar132 <= 0.0) && (0.0 <= dVar131)) || (ABS(dVar131 + dVar132) < 1e-08)) {
                    dVar124 = 0.0;
                  }
                  else {
                    uVar72 = -(ulong)(0.0 <= dVar131 + dVar132);
                    dVar124 = (double)(~uVar72 & (ulong)dVar131 | (ulong)dVar132 & uVar72);
                  }
                  pdVar26[lVar52] = dVar124;
                  lVar52 = lVar52 + 1;
                } while ((iVar110 - iVar48) + 1 != (int)lVar52);
              }
              iVar57 = iVar57 + 1;
              local_420 = local_420 + lVar90;
              pdVar26 = pdVar26 + lVar32;
              local_4b8 = local_4b8 + lVar28;
              local_398 = local_398 + lVar28;
              pdVar54 = pdVar54 + lVar85;
              pdVar59 = pdVar59 + lVar85;
              pdVar45 = pdVar45 + lVar85;
              pdVar55 = pdVar55 + lVar85;
              local_530 = local_530 + lVar78;
              local_548 = (double *)((long)local_548 + lVar78);
              local_538 = (double *)((long)local_538 + lVar78);
              local_4d8 = local_4d8 + lVar78;
              lVar39 = lVar39 + lVar42;
              lVar70 = lVar70 + lVar42;
              pdVar47 = pdVar47 + lVar13;
              pdVar35 = pdVar35 + lVar13;
              local_418 = (double *)((long)local_418 + lVar21);
              lVar33 = lVar33 + lVar21;
            }
            local_528 = local_528 + lVar113;
            local_3b8 = local_3b8 + lVar113;
            pdVar64 = pdVar64 + lVar31;
            local_450 = local_450 + lVar84;
            local_410 = local_410 + lVar84;
            pdVar25 = pdVar25 + lVar34;
            pdVar43 = pdVar43 + lVar34;
            pdVar44 = pdVar44 + lVar34;
            pdVar80 = pdVar80 + lVar34;
            local_4c8 = local_4c8 + lVar79;
            local_4d0 = local_4d0 + lVar79;
            local_4b0 = local_4b0 + lVar79;
            local_440 = local_440 + lVar79;
            lVar41 = lVar41 + lVar27;
            lVar56 = lVar56 + lVar27;
            pdVar46 = pdVar46 + lVar87;
            pdVar107 = pdVar107 + lVar87;
            local_3e8 = local_3e8 + lVar67;
            local_3f0 = local_3f0 + lVar67;
          } while( true );
        }
        lVar101 = (lVar56 - lVar94) * lVar113;
        lVar22 = lVar77;
        lVar105 = lVar78;
        pdVar43 = local_520;
        lVar92 = lVar82;
        lVar100 = lVar84;
        pdVar25 = pdVar44;
        pdVar45 = pdVar64;
        pdVar35 = pdVar46;
        pdVar47 = pdVar107;
        for (local_538 = (double *)lVar83; (long)local_538 <= (long)aiStack_2ac[1] + 1;
            local_538 = (double *)((long)local_538 + 1)) {
          if (local_2b8 <= iVar36) {
            lVar108 = ((long)local_538 - lVar103) * lVar90;
            lVar115 = 0;
            do {
              pdVar59 = (double *)(lVar100 + lVar115 * 8);
              dVar131 = pdVar35[lVar115];
              dVar132 = (pdVar35 + lVar115)[1];
              pdVar26 = (double *)(lVar105 + lVar115 * 8);
              dVar133 = pdVar47[lVar115];
              dVar16 = (pdVar47 + lVar115)[1];
              dVar131 = *(double *)(lVar22 + lVar115 * 8) +
                        (*pdVar59 * dVar131 - *pdVar26 * dVar133) * dVar123 +
                        (dVar131 - dVar133) * pdVar25[lVar115] * dVar124 + 0.0;
              dVar132 = *(double *)(lVar92 + lVar115 * 8) +
                        (pdVar59[1] * dVar132 - pdVar26[1] * dVar16) * dVar123 +
                        (dVar132 - dVar16) * (pdVar25 + lVar115)[1] * dVar124 + 0.0;
              if (lVar73 < lVar76 + lVar115) {
                if (lVar118 < lVar76 + lVar115) {
                  switch(pbc[1].bc[3]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar132 = dVar131;
                    break;
                  case 3:
                    dVar132 = pdVar14[lVar108 + (long)(int)(local_1d4 - uVar1) + lVar101 + lVar23];
                    break;
                  case -1:
                    goto switchD_003839bb_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[1].bc[0]) {
                case 1:
                case 2:
                case 4:
                  dVar131 = dVar132;
                  break;
                case 3:
                  dVar131 = pdVar14[lVar108 + (long)(int)(~uVar1 + iVar88) + lVar101 + lVar23];
                  break;
                case -1:
switchD_003839bb_caseD_ffffffff:
                  dVar132 = 0.0;
                  dVar131 = 0.0;
                }
              }
              uVar72 = -(ulong)(0.0 <= pdVar45[lVar115]);
              dVar133 = (double)(~-(ulong)(ABS(pdVar45[lVar115]) < 1e-08) & 0x3ff0000000000000);
              pdVar43[lVar115] =
                   dVar133 * (double)(~uVar72 & (ulong)dVar132 | uVar72 & (ulong)dVar131) +
                   (dVar132 + dVar131) * (1.0 - dVar133) * 0.5;
              lVar115 = lVar115 + 1;
            } while (iVar48 - local_2b8 != (int)lVar115);
          }
          pdVar43 = pdVar43 + (iVar48 - lVar76);
          pdVar45 = pdVar45 + lVar13;
          pdVar25 = pdVar25 + lVar90;
          pdVar47 = pdVar47 + lVar85;
          pdVar35 = pdVar35 + lVar85;
          lVar105 = lVar105 + lVar79;
          lVar100 = lVar100 + lVar79;
          lVar92 = lVar92 + lVar40;
          lVar22 = lVar22 + lVar40;
        }
        local_520 = local_520 + lVar30 * lVar66;
        pdVar64 = pdVar64 + lVar87;
        pdVar44 = pdVar44 + lVar113;
        pdVar107 = pdVar107 + lVar34;
        pdVar46 = pdVar46 + lVar34;
        lVar78 = lVar78 + lVar33;
        lVar84 = lVar84 + lVar33;
        lVar82 = lVar82 + local_210;
        lVar77 = lVar77 + local_210;
        lVar56 = lVar56 + 1;
      } while( true );
    }
    lVar42 = (long)iVar110;
    while (lVar42 <= iVar2) {
      if (iVar65 < iVar36) {
        lVar42 = lVar42 + 1;
      }
      else {
        lVar76 = lVar42 + 1;
        lVar92 = lVar42 - lVar77;
        lVar108 = lVar42 - lVar74;
        lVar100 = lVar42 - lVar82;
        lVar115 = lVar42 - iVar48;
        lVar101 = (lVar42 - lVar52) * lVar85 * 8;
        lVar94 = lVar42 * 8;
        lVar103 = lVar42 * 8;
        lVar66 = lVar42 * 8;
        lVar104 = lVar42 * 8;
        lVar22 = lVar42 * 8;
        lVar105 = lVar42 * 8;
        lVar120 = 0;
        do {
          pdVar64 = (double *)((long)local_498 + lVar120 * 8 + (lVar76 - lVar77) * lVar13);
          pdVar107 = (double *)((long)local_498 + lVar120 * 8 + lVar92 * lVar13);
          pdVar14 = (double *)((long)local_518 + lVar120 * 8 + (lVar102 + 8 + lVar104) * lVar91);
          pdVar24 = (double *)((long)local_518 + lVar120 * 8 + (lVar102 + lVar66) * lVar91);
          pdVar46 = (double *)((long)local_528 + lVar120 * 8 + lVar101);
          pdVar43 = (double *)((long)local_478 + lVar120 * 8 + lVar101);
          pdVar45 = (double *)
                    ((long)local_4a0 +
                    lVar120 * 8 +
                    (((lVar28 + 1) - lVar50) * lVar41 * 8 + lVar84 * -8 + lVar103) * lVar91);
          pdVar25 = (double *)
                    ((long)local_4a0 +
                    lVar120 * 8 + ((lVar28 - lVar50) * lVar41 * 8 + lVar84 * -8 + lVar94) * lVar91);
          dVar131 = (*pdVar43 + *pdVar46) * dVar129 * (*pdVar45 - *pdVar25) +
                    *(double *)
                     ((lVar105 + (lVar28 - lVar20) * lVar93 * 8 + lVar95 * -8) * lVar53 +
                      (long)local_520 + lVar120 * 8) +
                    (*pdVar107 + *pdVar64) * dVar128 * (*pdVar14 - *pdVar24);
          dVar132 = (pdVar43[1] + pdVar46[1]) * dVar129 * (pdVar45[1] - pdVar25[1]) +
                    *(double *)
                     (((lVar28 * 8 + local_68 * 8 + lVar20 * -8) * lVar93 + lVar95 * -8 + lVar22) *
                      lVar53 + (long)local_520 + lVar120 * 8) +
                    (pdVar107[1] + pdVar64[1]) * dVar128 * (pdVar14[1] - pdVar24[1]);
          if (!l_use_forces_in_trans) {
            pdVar64 = (double *)(lVar108 * lVar30 * 8 + local_4e8 + lVar120 * 8);
            dVar131 = dVar131 + *pdVar64 * dVar130;
            dVar132 = dVar132 + pdVar64[1] * dVar134;
          }
          iVar117 = pbc->bc[3];
          if (lVar73 - lVar78 != lVar120) {
            if (lVar27 == lVar120) {
              switch(iVar117) {
              case 1:
              case 2:
              case 4:
                goto switchD_003831a5_caseD_1;
              case 3:
                lVar42 = local_1d4 - local_130;
                goto LAB_003831c7;
              case -1:
                goto switchD_0038317c_caseD_ffffffff;
              }
            }
            goto switchD_0038317c_caseD_0;
          }
          switch(pbc->bc[0]) {
          case 1:
            dVar131 = dVar132;
            break;
          case 2:
          case 4:
            dVar131 = 0.0;
            if (dVar132 <= 0.0) {
              dVar131 = dVar132;
            }
            goto switchD_003831a5_caseD_1;
          case 3:
            lVar42 = (long)(int)(~uVar9 + iVar88);
LAB_003831c7:
            dVar131 = pdVar109[(lVar23 - lVar83) * lVar32 + lVar100 * lVar31 + lVar42];
switchD_003831a5_caseD_1:
            dVar132 = dVar131;
            break;
          case -1:
switchD_0038317c_caseD_ffffffff:
            dVar131 = 0.0;
            dVar132 = 0.0;
          }
switchD_0038317c_caseD_0:
          dVar133 = dVar131;
          if (((lVar27 == lVar120) && ((iVar117 == 4 || (iVar117 == 2)))) &&
             (dVar133 = 0.0, dVar132 = 0.0, 0.0 <= dVar131)) {
            dVar133 = dVar131;
            dVar132 = dVar131;
          }
          if (((dVar133 <= 0.0) && (0.0 <= dVar132)) || (ABS(dVar132 + dVar133) < 1e-08)) {
            uVar72 = 0;
          }
          else {
            uVar72 = -(ulong)(0.0 <= dVar132 + dVar133);
            uVar72 = ~uVar72 & (ulong)dVar132 | (ulong)dVar133 & uVar72;
          }
          *(ulong *)((long)local_4e0 + lVar120 * 8 + lVar115 * lVar90 * 8) = uVar72;
          lVar120 = lVar120 + 1;
          lVar42 = lVar76;
        } while ((iVar65 - iVar36) + 1 != (int)lVar120);
      }
    }
    local_4e0 = local_4e0 + lVar86;
    local_4e8 = local_4e8 + lVar113;
    local_478 = local_478 + lVar34;
    local_528 = local_528 + lVar34;
    local_4a0 = local_4a0 + lVar91 * lVar41;
    local_518 = local_518 + lVar87;
    local_498 = local_498 + lVar70;
    local_520 = (double *)((long)local_520 + local_210);
    lVar23 = lVar23 + 1;
  } while( true );
}

Assistant:

void
Godunov::ExtrapVelToFacesOnBox ( Box const& bx, int ncomp,
                                 Box const& xbx,
                                 Box const& ybx,
                                 Box const& zbx,
                                 Array4<Real> const& qx,
                                 Array4<Real> const& qy,
                                 Array4<Real> const& qz,
                                 Array4<Real const> const& q,
                                 Array4<Real const> const& u_ad,
                                 Array4<Real const> const& v_ad,
                                 Array4<Real const> const& w_ad,
                                 Array4<Real> const& Imx,
                                 Array4<Real> const& Imy,
                                 Array4<Real> const& Imz,
                                 Array4<Real> const& Ipx,
                                 Array4<Real> const& Ipy,
                                 Array4<Real> const& Ipz,
                                 Array4<Real const> const& f,
                                 const Box& domain,
                                 const Real* dx_arr,
                                 Real l_dt,
                                 BCRec  const* pbc,
                                 bool l_use_forces_in_trans,
                                 Real* p)
{

    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    Real dx = dx_arr[0];
    Real dy = dx_arr[1];
    Real dz = dx_arr[2];

    Box xebox = Box(bx).grow(1,1).grow(2,1).surroundingNodes(0);
    Box yebox = Box(bx).grow(0,1).grow(2,1).surroundingNodes(1);
    Box zebox = Box(bx).grow(0,1).grow(1,1).surroundingNodes(2);

    Array4<Real> xlo = makeArray4(p, xebox, ncomp);
    p += xlo.size();
    Array4<Real> xhi = makeArray4(p, xebox, ncomp);
    p += xhi.size();
    Array4<Real> ylo = makeArray4(p, yebox, ncomp);
    p += ylo.size();
    Array4<Real> yhi = makeArray4(p, yebox, ncomp);
    p += yhi.size();
    Array4<Real> zlo = makeArray4(p, zebox, ncomp);
    p += zlo.size();
    Array4<Real> zhi = makeArray4(p, zebox, ncomp);
    p += zhi.size();

    amrex::ParallelFor(
    xebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        Real uad = u_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        xlo(i,j,k,n) = lo;
        xhi(i,j,k,n) = hi;

        Real st = (uad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        Imx(i, j, k, n) = fu*st + (1.0 - fu) *0.5 * (hi + lo); // store xedge
    },
    yebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        Real vad = v_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        ylo(i,j,k,n) = lo;
        yhi(i,j,k,n) = hi;

        Real st = (vad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        Imy(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store yedge
    },
    zebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        Real wad = w_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        zlo(i,j,k,n) = lo;
        zhi(i,j,k,n) = hi;

        Real st = (wad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        Imz(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store zedge
    }
    );


    Array4<Real> xedge = Imx;
    Array4<Real> yedge = Imy;
    Array4<Real> zedge = Imz;

    Array4<Real> divu = makeArray4(Ipx.dataPtr(), grow(bx,1), 1);
    amrex::ParallelFor(Box(divu), [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept {
        divu(i,j,k) = 0.0;
    });

    //
    // X-Flux
    //
    Box const xbxtmp = Box(xbx).enclosedCells().grow(0,1);
    Array4<Real> yzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(xbxtmp,1), 1);
    Array4<Real> zylo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(xbxtmp,2), 1);

    // Add d/dy term to z-faces
    // Start with {zlo,zhi} --> {zylo, zyhi} and upwind using w_ad to {zylo}
    // Add d/dz to y-faces
    // Start with {ylo,yhi} --> {yzlo, yzhi} and upwind using v_ad to {yzlo}
    amrex::ParallelFor(Box(zylo), Box(yzlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_zylo, l_zyhi;
        GodunovCornerCouple::AddCornerCoupleTermZY(l_zylo, l_zyhi,
                              i, j, k, n, l_dt, dy, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zylo, l_zyhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);


        Real st = (wad >= 0.) ? l_zylo : l_zyhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zyhi + l_zylo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_yzlo, l_yzhi;
        GodunovCornerCouple::AddCornerCoupleTermYZ(l_yzlo, l_yzhi,
                              i, j, k, n, l_dt, dz, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yzlo, l_yzhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = (vad >= 0.) ? l_yzlo : l_yzhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yzhi + l_yzlo);
    });

    //
    amrex::ParallelFor(xbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        auto bc = pbc[n];

        Real stl = xlo(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i-1,j+1,k  )+v_ad(i-1,j,k))*
                                                 (yzlo(i-1,j+1,k  )-yzlo(i-1,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i-1,j  ,k+1)+w_ad(i-1,j,k))*
                                                 (zylo(i-1,j  ,k+1)-zylo(i-1,j,k));
        Real sth = xhi(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i  ,j,k))*
                                                 (yzlo(i  ,j+1,k  )-yzlo(i  ,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i  ,j,k))*
                                                 (zylo(i  ,j  ,k+1)-zylo(i  ,j,k));

        if (!l_use_forces_in_trans)
        {
            stl += 0.5 * l_dt * f(i-1,j,k,n);
            sth += 0.5 * l_dt * f(i  ,j,k,n);
        }

        HydroBC::SetXEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(0), dlo.x, bc.hi(0), dhi.x, true);

        if ( (i==dlo.x) && (bc.lo(0) == BCType::foextrap || bc.lo(0) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (i==dhi.x+1) && (bc.hi(0) == BCType::foextrap || bc.hi(0) == BCType::hoextrap) )
        {
             stl = amrex::max(stl,0.0_rt);
             sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qx(i,j,k) = ltm ? 0. : st;
    });

    //
    // Y-Flux
    //
    Box const ybxtmp = Box(ybx).enclosedCells().grow(1,1);
    Array4<Real> xzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(ybxtmp,0), 1);
    Array4<Real> zxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(ybxtmp,2), 1);

    // Add d/dz to x-faces
    // Start with {xlo,xhi} --> {xzlo, xzhi} and upwind using u_ad to {xzlo}
    // Add d/dx term to z-faces
    // Start with {zlo,zhi} --> {zxlo, zxhi} and upwind using w_ad to {zxlo}
    amrex::ParallelFor(Box(xzlo), Box(zxlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_xzlo, l_xzhi;
        GodunovCornerCouple::AddCornerCoupleTermXZ(l_xzlo, l_xzhi,
                              i, j, k, n, l_dt, dz, false,
                              xlo(i,j,k,n),  xhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xzlo, l_xzhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xzlo : l_xzhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xzhi + l_xzlo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_zxlo, l_zxhi;
        GodunovCornerCouple::AddCornerCoupleTermZX(l_zxlo, l_zxhi,
                              i, j, k, n, l_dt, dx, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zxlo, l_zxhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = (wad >= 0.) ? l_zxlo : l_zxhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zxhi + l_zxlo);
    });

    //
    amrex::ParallelFor(ybx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        auto bc = pbc[n];

        Real stl = ylo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j-1,k  )+u_ad(i,j-1,k))*
                                                 (xzlo(i+1,j-1,k  )-xzlo(i,j-1,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j-1,k+1)+w_ad(i,j-1,k))*
                                                 (zxlo(i  ,j-1,k+1)-zxlo(i,j-1,k));
        Real sth = yhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j  ,k))*
                                                 (xzlo(i+1,j  ,k  )-xzlo(i,j  ,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i,j  ,k))*
                                                 (zxlo(i  ,j  ,k+1)-zxlo(i,j  ,k));


        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j-1,k,n);
           sth += 0.5 * l_dt * f(i,j  ,k,n);
        }

        HydroBC::SetYEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(1), dlo.y, bc.hi(1), dhi.y, true);

        if ( (j==dlo.y) && (bc.lo(1) == BCType::foextrap || bc.lo(1) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (j==dhi.y+1) && (bc.hi(1) == BCType::foextrap || bc.hi(1) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qy(i,j,k) = ltm ? 0. : st;
    });


    //
    // Z-Flux
    //
    Box const zbxtmp = Box(zbx).enclosedCells().grow(2,1);
    Array4<Real> xylo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(zbxtmp,0), 1);
    Array4<Real> yxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(zbxtmp,1), 1);

    amrex::ParallelFor(Box(xylo), Box(yxlo),
    //
    // Add d/dy term to x-faces
    // Start with {xlo,xhi} --> {xylo, xyhi} and upwind using u_ad to {xylo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_xylo, l_xyhi;
        GodunovCornerCouple::AddCornerCoupleTermXY(l_xylo, l_xyhi,
                              i, j, k, n, l_dt, dy, false,
                              xlo(i,j,k,n), xhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xylo, l_xyhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xylo : l_xyhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xyhi + l_xylo);
    },
    //
    // Add d/dx term to y-faces
    // Start with {ylo,yhi} --> {yxlo, yxhi} and upwind using v_ad to {yxlo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_yxlo, l_yxhi;
        GodunovCornerCouple::AddCornerCoupleTermYX(l_yxlo, l_yxhi,
                              i, j, k, n, l_dt, dx, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yxlo, l_yxhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);


        Real st = (vad >= 0.) ? l_yxlo : l_yxhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yxhi + l_yxlo);
    });
    //
    amrex::ParallelFor(zbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        auto bc = pbc[n];
        Real stl = zlo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k-1)+u_ad(i,j,k-1))*
                                                 (xylo(i+1,j  ,k-1)-xylo(i,j,k-1))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k-1)+v_ad(i,j,k-1))*
                                                 (yxlo(i  ,j+1,k-1)-yxlo(i,j,k-1));
        Real sth = zhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j,k  ))*
                                                 (xylo(i+1,j  ,k  )-xylo(i,j,k  ))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i,j,k  ))*
                                                 (yxlo(i  ,j+1,k  )-yxlo(i,j,k  ));

        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j,k-1,n);
           sth += 0.5 * l_dt * f(i,j,k  ,n);
        }

        HydroBC::SetZEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(2), dlo.z, bc.hi(2), dhi.z, true);

        if ( (k==dlo.z) && (bc.lo(2) == BCType::foextrap || bc.lo(2) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (k==dhi.z+1) && (bc.hi(2) == BCType::foextrap || bc.hi(2) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qz(i,j,k) = ltm ? 0. : st;
    });
}